

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

bool embree::avx512::CurveNiMBIntersectorK<8,4>::
     occluded_t<embree::avx512::RibbonCurve1IntersectorK<embree::BezierCurveT,4,8>,embree::avx512::Occluded1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  Primitive PVar12;
  int iVar13;
  __int_type_conflict _Var14;
  long lVar15;
  RTCFilterFunctionN p_Var16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  undefined8 uVar24;
  long lVar25;
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  RayK<4> *pRVar82;
  byte bVar83;
  ulong uVar84;
  ulong uVar85;
  long lVar86;
  ulong uVar87;
  Geometry *pGVar88;
  bool bVar89;
  uint uVar90;
  Geometry *geometry;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  long lVar91;
  ulong uVar92;
  float fVar93;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  float fVar138;
  float fVar140;
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar99 [16];
  float fVar139;
  float fVar141;
  float fVar142;
  float fVar143;
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  float fVar144;
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  float fVar145;
  undefined4 uVar146;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined8 uVar147;
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [16];
  undefined1 auVar156 [32];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [32];
  float fVar160;
  float fVar161;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  float fVar166;
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  float fVar167;
  float fVar168;
  float fVar173;
  float fVar174;
  float fVar175;
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [16];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [16];
  undefined1 auVar189 [32];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [64];
  undefined1 auVar196 [16];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [64];
  undefined1 auVar201 [64];
  undefined1 auVar202 [64];
  undefined1 auVar203 [64];
  undefined1 auVar204 [64];
  undefined1 auVar205 [64];
  undefined1 auVar206 [64];
  undefined1 auVar207 [64];
  undefined1 auVar208 [64];
  undefined1 auVar209 [64];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::CubicBezierCurve<embree::Vec3fx>,_8> bhit;
  bool local_6e9;
  undefined8 local_6d0;
  undefined8 uStack_6c8;
  ulong local_6b8;
  Geometry *local_6b0;
  Precalculations *local_6a8;
  RTCFilterFunctionNArguments local_6a0;
  undefined1 local_670 [8];
  float fStack_668;
  float fStack_664;
  undefined1 local_660 [16];
  undefined4 local_650;
  undefined4 uStack_64c;
  undefined8 uStack_648;
  undefined1 local_640 [16];
  undefined1 local_630 [16];
  undefined1 local_620 [16];
  undefined1 local_610 [16];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  float local_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined8 local_580;
  undefined8 uStack_578;
  LinearSpace3fa *local_570;
  Primitive *local_568;
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  float local_520;
  float fStack_51c;
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [16];
  undefined1 local_410 [16];
  undefined1 local_400 [16];
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [32];
  undefined8 local_3c0;
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float fStack_3a4;
  undefined4 local_3a0;
  undefined4 uStack_39c;
  undefined4 uStack_398;
  undefined4 uStack_394;
  undefined4 uStack_390;
  undefined4 uStack_38c;
  undefined4 uStack_388;
  undefined4 uStack_384;
  undefined4 local_370;
  undefined4 uStack_36c;
  undefined4 uStack_368;
  undefined4 uStack_364;
  undefined1 local_360 [16];
  undefined1 local_350 [16];
  float local_340;
  float fStack_33c;
  float fStack_338;
  float fStack_334;
  undefined4 local_330;
  undefined4 uStack_32c;
  undefined4 uStack_328;
  undefined4 uStack_324;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined1 local_310 [16];
  uint local_300;
  uint uStack_2fc;
  uint uStack_2f8;
  uint uStack_2f4;
  uint uStack_2f0;
  uint uStack_2ec;
  uint uStack_2e8;
  uint uStack_2e4;
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined4 local_280;
  int local_27c;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  byte local_230;
  float local_220 [4];
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [8];
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  undefined4 uStack_e4;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar12 = prim[1];
  uVar92 = (ulong)(byte)PVar12;
  lVar25 = uVar92 * 0x25;
  fVar168 = *(float *)(prim + lVar25 + 0x12);
  auVar94 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar94 = vinsertps_avx(auVar94,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar95 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar97 = vinsertps_avx(auVar95,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar98 = vsubps_avx(auVar94,*(undefined1 (*) [16])(prim + lVar25 + 6));
  fVar160 = fVar168 * auVar98._0_4_;
  fVar145 = fVar168 * auVar97._0_4_;
  auVar94._8_8_ = 0;
  auVar94._0_8_ = *(ulong *)(prim + uVar92 * 4 + 6);
  auVar106 = vpmovsxbd_avx2(auVar94);
  auVar95._8_8_ = 0;
  auVar95._0_8_ = *(ulong *)(prim + uVar92 * 5 + 6);
  auVar105 = vpmovsxbd_avx2(auVar95);
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar96._8_8_ = 0;
  auVar96._0_8_ = *(ulong *)(prim + uVar92 * 6 + 6);
  auVar117 = vpmovsxbd_avx2(auVar96);
  auVar117 = vcvtdq2ps_avx(auVar117);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar92 * 0xf + 6);
  auVar116 = vpmovsxbd_avx2(auVar6);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar12 * 0x10 + 6);
  auVar110 = vpmovsxbd_avx2(auVar7);
  auVar116 = vcvtdq2ps_avx(auVar116);
  auVar107 = vcvtdq2ps_avx(auVar110);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar12 * 0x10 + uVar92 + 6);
  auVar108 = vpmovsxbd_avx2(auVar8);
  auVar108 = vcvtdq2ps_avx(auVar108);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar92 * 0x1a + 6);
  auVar115 = vpmovsxbd_avx2(auVar9);
  auVar115 = vcvtdq2ps_avx(auVar115);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar92 * 0x1b + 6);
  auVar109 = vpmovsxbd_avx2(auVar10);
  auVar109 = vcvtdq2ps_avx(auVar109);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar92 * 0x1c + 6);
  auVar104 = vpmovsxbd_avx2(auVar11);
  auVar111 = vcvtdq2ps_avx(auVar104);
  auVar178._4_4_ = fVar145;
  auVar178._0_4_ = fVar145;
  auVar178._8_4_ = fVar145;
  auVar178._12_4_ = fVar145;
  auVar178._16_4_ = fVar145;
  auVar178._20_4_ = fVar145;
  auVar178._24_4_ = fVar145;
  auVar178._28_4_ = fVar145;
  auVar197._8_4_ = 1;
  auVar197._0_8_ = 0x100000001;
  auVar197._12_4_ = 1;
  auVar197._16_4_ = 1;
  auVar197._20_4_ = 1;
  auVar197._24_4_ = 1;
  auVar197._28_4_ = 1;
  auVar102 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar113 = ZEXT1632(CONCAT412(fVar168 * auVar97._12_4_,
                                CONCAT48(fVar168 * auVar97._8_4_,
                                         CONCAT44(fVar168 * auVar97._4_4_,fVar145))));
  auVar112 = vpermps_avx2(auVar197,auVar113);
  auVar103 = vpermps_avx512vl(auVar102,auVar113);
  fVar167 = auVar103._0_4_;
  fVar173 = auVar103._4_4_;
  auVar113._4_4_ = fVar173 * auVar117._4_4_;
  auVar113._0_4_ = fVar167 * auVar117._0_4_;
  fVar174 = auVar103._8_4_;
  auVar113._8_4_ = fVar174 * auVar117._8_4_;
  fVar175 = auVar103._12_4_;
  auVar113._12_4_ = fVar175 * auVar117._12_4_;
  fVar161 = auVar103._16_4_;
  auVar113._16_4_ = fVar161 * auVar117._16_4_;
  fVar166 = auVar103._20_4_;
  auVar113._20_4_ = fVar166 * auVar117._20_4_;
  fVar93 = auVar103._24_4_;
  auVar113._24_4_ = fVar93 * auVar117._24_4_;
  auVar113._28_4_ = auVar110._28_4_;
  auVar110._4_4_ = auVar108._4_4_ * fVar173;
  auVar110._0_4_ = auVar108._0_4_ * fVar167;
  auVar110._8_4_ = auVar108._8_4_ * fVar174;
  auVar110._12_4_ = auVar108._12_4_ * fVar175;
  auVar110._16_4_ = auVar108._16_4_ * fVar161;
  auVar110._20_4_ = auVar108._20_4_ * fVar166;
  auVar110._24_4_ = auVar108._24_4_ * fVar93;
  auVar110._28_4_ = auVar104._28_4_;
  auVar104._4_4_ = auVar111._4_4_ * fVar173;
  auVar104._0_4_ = auVar111._0_4_ * fVar167;
  auVar104._8_4_ = auVar111._8_4_ * fVar174;
  auVar104._12_4_ = auVar111._12_4_ * fVar175;
  auVar104._16_4_ = auVar111._16_4_ * fVar161;
  auVar104._20_4_ = auVar111._20_4_ * fVar166;
  auVar104._24_4_ = auVar111._24_4_ * fVar93;
  auVar104._28_4_ = auVar103._28_4_;
  auVar94 = vfmadd231ps_fma(auVar113,auVar112,auVar105);
  auVar95 = vfmadd231ps_fma(auVar110,auVar112,auVar107);
  auVar96 = vfmadd231ps_fma(auVar104,auVar109,auVar112);
  auVar94 = vfmadd231ps_fma(ZEXT1632(auVar94),auVar178,auVar106);
  auVar95 = vfmadd231ps_fma(ZEXT1632(auVar95),auVar178,auVar116);
  auVar96 = vfmadd231ps_fma(ZEXT1632(auVar96),auVar115,auVar178);
  auVar194._4_4_ = fVar160;
  auVar194._0_4_ = fVar160;
  auVar194._8_4_ = fVar160;
  auVar194._12_4_ = fVar160;
  auVar194._16_4_ = fVar160;
  auVar194._20_4_ = fVar160;
  auVar194._24_4_ = fVar160;
  auVar194._28_4_ = fVar160;
  auVar104 = ZEXT1632(CONCAT412(fVar168 * auVar98._12_4_,
                                CONCAT48(fVar168 * auVar98._8_4_,
                                         CONCAT44(fVar168 * auVar98._4_4_,fVar160))));
  auVar110 = vpermps_avx2(auVar197,auVar104);
  auVar104 = vpermps_avx512vl(auVar102,auVar104);
  fVar168 = auVar104._0_4_;
  fVar167 = auVar104._4_4_;
  auVar112._4_4_ = fVar167 * auVar117._4_4_;
  auVar112._0_4_ = fVar168 * auVar117._0_4_;
  fVar173 = auVar104._8_4_;
  auVar112._8_4_ = fVar173 * auVar117._8_4_;
  fVar174 = auVar104._12_4_;
  auVar112._12_4_ = fVar174 * auVar117._12_4_;
  fVar175 = auVar104._16_4_;
  auVar112._16_4_ = fVar175 * auVar117._16_4_;
  fVar161 = auVar104._20_4_;
  auVar112._20_4_ = fVar161 * auVar117._20_4_;
  fVar166 = auVar104._24_4_;
  auVar112._24_4_ = fVar166 * auVar117._24_4_;
  auVar112._28_4_ = fVar145;
  auVar102._4_4_ = auVar108._4_4_ * fVar167;
  auVar102._0_4_ = auVar108._0_4_ * fVar168;
  auVar102._8_4_ = auVar108._8_4_ * fVar173;
  auVar102._12_4_ = auVar108._12_4_ * fVar174;
  auVar102._16_4_ = auVar108._16_4_ * fVar175;
  auVar102._20_4_ = auVar108._20_4_ * fVar161;
  auVar102._24_4_ = auVar108._24_4_ * fVar166;
  auVar102._28_4_ = auVar117._28_4_;
  auVar108._4_4_ = auVar111._4_4_ * fVar167;
  auVar108._0_4_ = auVar111._0_4_ * fVar168;
  auVar108._8_4_ = auVar111._8_4_ * fVar173;
  auVar108._12_4_ = auVar111._12_4_ * fVar174;
  auVar108._16_4_ = auVar111._16_4_ * fVar175;
  auVar108._20_4_ = auVar111._20_4_ * fVar161;
  auVar108._24_4_ = auVar111._24_4_ * fVar166;
  auVar108._28_4_ = auVar104._28_4_;
  auVar6 = vfmadd231ps_fma(auVar112,auVar110,auVar105);
  auVar7 = vfmadd231ps_fma(auVar102,auVar110,auVar107);
  auVar8 = vfmadd231ps_fma(auVar108,auVar110,auVar109);
  auVar97 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar194,auVar106);
  auVar98 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar194,auVar116);
  auVar186._8_4_ = 0x7fffffff;
  auVar186._0_8_ = 0x7fffffff7fffffff;
  auVar186._12_4_ = 0x7fffffff;
  auVar186._16_4_ = 0x7fffffff;
  auVar186._20_4_ = 0x7fffffff;
  auVar186._24_4_ = 0x7fffffff;
  auVar186._28_4_ = 0x7fffffff;
  auVar155 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar194,auVar115);
  auVar106 = vandps_avx(auVar186,ZEXT1632(auVar94));
  auVar182._8_4_ = 0x219392ef;
  auVar182._0_8_ = 0x219392ef219392ef;
  auVar182._12_4_ = 0x219392ef;
  auVar182._16_4_ = 0x219392ef;
  auVar182._20_4_ = 0x219392ef;
  auVar182._24_4_ = 0x219392ef;
  auVar182._28_4_ = 0x219392ef;
  uVar84 = vcmpps_avx512vl(auVar106,auVar182,1);
  bVar89 = (bool)((byte)uVar84 & 1);
  auVar103._0_4_ = (uint)bVar89 * 0x219392ef | (uint)!bVar89 * auVar94._0_4_;
  bVar89 = (bool)((byte)(uVar84 >> 1) & 1);
  auVar103._4_4_ = (uint)bVar89 * 0x219392ef | (uint)!bVar89 * auVar94._4_4_;
  bVar89 = (bool)((byte)(uVar84 >> 2) & 1);
  auVar103._8_4_ = (uint)bVar89 * 0x219392ef | (uint)!bVar89 * auVar94._8_4_;
  bVar89 = (bool)((byte)(uVar84 >> 3) & 1);
  auVar103._12_4_ = (uint)bVar89 * 0x219392ef | (uint)!bVar89 * auVar94._12_4_;
  auVar103._16_4_ = (uint)((byte)(uVar84 >> 4) & 1) * 0x219392ef;
  auVar103._20_4_ = (uint)((byte)(uVar84 >> 5) & 1) * 0x219392ef;
  auVar103._24_4_ = (uint)((byte)(uVar84 >> 6) & 1) * 0x219392ef;
  auVar103._28_4_ = (uint)(byte)(uVar84 >> 7) * 0x219392ef;
  auVar106 = vandps_avx(auVar186,ZEXT1632(auVar95));
  uVar84 = vcmpps_avx512vl(auVar106,auVar182,1);
  bVar89 = (bool)((byte)uVar84 & 1);
  auVar114._0_4_ = (uint)bVar89 * 0x219392ef | (uint)!bVar89 * auVar95._0_4_;
  bVar89 = (bool)((byte)(uVar84 >> 1) & 1);
  auVar114._4_4_ = (uint)bVar89 * 0x219392ef | (uint)!bVar89 * auVar95._4_4_;
  bVar89 = (bool)((byte)(uVar84 >> 2) & 1);
  auVar114._8_4_ = (uint)bVar89 * 0x219392ef | (uint)!bVar89 * auVar95._8_4_;
  bVar89 = (bool)((byte)(uVar84 >> 3) & 1);
  auVar114._12_4_ = (uint)bVar89 * 0x219392ef | (uint)!bVar89 * auVar95._12_4_;
  auVar114._16_4_ = (uint)((byte)(uVar84 >> 4) & 1) * 0x219392ef;
  auVar114._20_4_ = (uint)((byte)(uVar84 >> 5) & 1) * 0x219392ef;
  auVar114._24_4_ = (uint)((byte)(uVar84 >> 6) & 1) * 0x219392ef;
  auVar114._28_4_ = (uint)(byte)(uVar84 >> 7) * 0x219392ef;
  auVar106 = vandps_avx(auVar186,ZEXT1632(auVar96));
  uVar84 = vcmpps_avx512vl(auVar106,auVar182,1);
  bVar89 = (bool)((byte)uVar84 & 1);
  auVar106._0_4_ = (uint)bVar89 * 0x219392ef | (uint)!bVar89 * auVar96._0_4_;
  bVar89 = (bool)((byte)(uVar84 >> 1) & 1);
  auVar106._4_4_ = (uint)bVar89 * 0x219392ef | (uint)!bVar89 * auVar96._4_4_;
  bVar89 = (bool)((byte)(uVar84 >> 2) & 1);
  auVar106._8_4_ = (uint)bVar89 * 0x219392ef | (uint)!bVar89 * auVar96._8_4_;
  bVar89 = (bool)((byte)(uVar84 >> 3) & 1);
  auVar106._12_4_ = (uint)bVar89 * 0x219392ef | (uint)!bVar89 * auVar96._12_4_;
  auVar106._16_4_ = (uint)((byte)(uVar84 >> 4) & 1) * 0x219392ef;
  auVar106._20_4_ = (uint)((byte)(uVar84 >> 5) & 1) * 0x219392ef;
  auVar106._24_4_ = (uint)((byte)(uVar84 >> 6) & 1) * 0x219392ef;
  auVar106._28_4_ = (uint)(byte)(uVar84 >> 7) * 0x219392ef;
  auVar105 = vrcp14ps_avx512vl(auVar103);
  auVar183._8_4_ = 0x3f800000;
  auVar183._0_8_ = &DAT_3f8000003f800000;
  auVar183._12_4_ = 0x3f800000;
  auVar183._16_4_ = 0x3f800000;
  auVar183._20_4_ = 0x3f800000;
  auVar183._24_4_ = 0x3f800000;
  auVar183._28_4_ = 0x3f800000;
  auVar94 = vfnmadd213ps_fma(auVar103,auVar105,auVar183);
  auVar94 = vfmadd132ps_fma(ZEXT1632(auVar94),auVar105,auVar105);
  auVar105 = vrcp14ps_avx512vl(auVar114);
  auVar95 = vfnmadd213ps_fma(auVar114,auVar105,auVar183);
  auVar95 = vfmadd132ps_fma(ZEXT1632(auVar95),auVar105,auVar105);
  auVar105 = vrcp14ps_avx512vl(auVar106);
  auVar96 = vfnmadd213ps_fma(auVar106,auVar105,auVar183);
  auVar96 = vfmadd132ps_fma(ZEXT1632(auVar96),auVar105,auVar105);
  fVar168 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar25 + 0x16)) *
            *(float *)(prim + lVar25 + 0x1a);
  auVar179._4_4_ = fVar168;
  auVar179._0_4_ = fVar168;
  auVar179._8_4_ = fVar168;
  auVar179._12_4_ = fVar168;
  auVar179._16_4_ = fVar168;
  auVar179._20_4_ = fVar168;
  auVar179._24_4_ = fVar168;
  auVar179._28_4_ = fVar168;
  auVar106 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar92 * 7 + 6));
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar105 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar92 * 0xb + 6));
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar105 = vsubps_avx(auVar105,auVar106);
  auVar117 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar92 * 9 + 6));
  auVar6 = vfmadd213ps_fma(auVar105,auVar179,auVar106);
  auVar106 = vcvtdq2ps_avx(auVar117);
  auVar105 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar92 * 0xd + 6));
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar105 = vsubps_avx(auVar105,auVar106);
  auVar7 = vfmadd213ps_fma(auVar105,auVar179,auVar106);
  auVar106 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar92 * 0x12 + 6));
  auVar106 = vcvtdq2ps_avx(auVar106);
  uVar84 = (ulong)(uint)((int)(uVar92 * 5) << 2);
  auVar105 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar92 * 2 + uVar84 + 6));
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar105 = vsubps_avx(auVar105,auVar106);
  auVar8 = vfmadd213ps_fma(auVar105,auVar179,auVar106);
  auVar106 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar84 + 6));
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar105 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar92 * 0x18 + 6));
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar105 = vsubps_avx(auVar105,auVar106);
  auVar9 = vfmadd213ps_fma(auVar105,auVar179,auVar106);
  auVar106 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar92 * 0x1d + 6));
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar105 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar92 + (ulong)(byte)PVar12 * 0x20 + 6));
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar105 = vsubps_avx(auVar105,auVar106);
  auVar10 = vfmadd213ps_fma(auVar105,auVar179,auVar106);
  auVar106 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + ((ulong)(byte)PVar12 * 0x20 - uVar92) + 6)
                           );
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar105 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar92 * 0x23 + 6));
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar105 = vsubps_avx(auVar105,auVar106);
  auVar11 = vfmadd213ps_fma(auVar105,auVar179,auVar106);
  auVar106 = vsubps_avx(ZEXT1632(auVar6),ZEXT1632(auVar97));
  auVar115._4_4_ = auVar94._4_4_ * auVar106._4_4_;
  auVar115._0_4_ = auVar94._0_4_ * auVar106._0_4_;
  auVar115._8_4_ = auVar94._8_4_ * auVar106._8_4_;
  auVar115._12_4_ = auVar94._12_4_ * auVar106._12_4_;
  auVar115._16_4_ = auVar106._16_4_ * 0.0;
  auVar115._20_4_ = auVar106._20_4_ * 0.0;
  auVar115._24_4_ = auVar106._24_4_ * 0.0;
  auVar115._28_4_ = auVar106._28_4_;
  auVar106 = vsubps_avx(ZEXT1632(auVar7),ZEXT1632(auVar97));
  auVar159._0_4_ = auVar94._0_4_ * auVar106._0_4_;
  auVar159._4_4_ = auVar94._4_4_ * auVar106._4_4_;
  auVar159._8_4_ = auVar94._8_4_ * auVar106._8_4_;
  auVar159._12_4_ = auVar94._12_4_ * auVar106._12_4_;
  auVar159._16_4_ = auVar106._16_4_ * 0.0;
  auVar159._20_4_ = auVar106._20_4_ * 0.0;
  auVar159._24_4_ = auVar106._24_4_ * 0.0;
  auVar159._28_4_ = 0;
  auVar106 = vsubps_avx(ZEXT1632(auVar8),ZEXT1632(auVar98));
  auVar109._4_4_ = auVar95._4_4_ * auVar106._4_4_;
  auVar109._0_4_ = auVar95._0_4_ * auVar106._0_4_;
  auVar109._8_4_ = auVar95._8_4_ * auVar106._8_4_;
  auVar109._12_4_ = auVar95._12_4_ * auVar106._12_4_;
  auVar109._16_4_ = auVar106._16_4_ * 0.0;
  auVar109._20_4_ = auVar106._20_4_ * 0.0;
  auVar109._24_4_ = auVar106._24_4_ * 0.0;
  auVar109._28_4_ = auVar106._28_4_;
  auVar106 = vsubps_avx(ZEXT1632(auVar9),ZEXT1632(auVar98));
  auVar156._0_4_ = auVar95._0_4_ * auVar106._0_4_;
  auVar156._4_4_ = auVar95._4_4_ * auVar106._4_4_;
  auVar156._8_4_ = auVar95._8_4_ * auVar106._8_4_;
  auVar156._12_4_ = auVar95._12_4_ * auVar106._12_4_;
  auVar156._16_4_ = auVar106._16_4_ * 0.0;
  auVar156._20_4_ = auVar106._20_4_ * 0.0;
  auVar156._24_4_ = auVar106._24_4_ * 0.0;
  auVar156._28_4_ = 0;
  auVar106 = vsubps_avx(ZEXT1632(auVar10),ZEXT1632(auVar155));
  auVar111._4_4_ = auVar96._4_4_ * auVar106._4_4_;
  auVar111._0_4_ = auVar96._0_4_ * auVar106._0_4_;
  auVar111._8_4_ = auVar96._8_4_ * auVar106._8_4_;
  auVar111._12_4_ = auVar96._12_4_ * auVar106._12_4_;
  auVar111._16_4_ = auVar106._16_4_ * 0.0;
  auVar111._20_4_ = auVar106._20_4_ * 0.0;
  auVar111._24_4_ = auVar106._24_4_ * 0.0;
  auVar111._28_4_ = auVar106._28_4_;
  auVar106 = vsubps_avx(ZEXT1632(auVar11),ZEXT1632(auVar155));
  auVar128._0_4_ = auVar96._0_4_ * auVar106._0_4_;
  auVar128._4_4_ = auVar96._4_4_ * auVar106._4_4_;
  auVar128._8_4_ = auVar96._8_4_ * auVar106._8_4_;
  auVar128._12_4_ = auVar96._12_4_ * auVar106._12_4_;
  auVar128._16_4_ = auVar106._16_4_ * 0.0;
  auVar128._20_4_ = auVar106._20_4_ * 0.0;
  auVar128._24_4_ = auVar106._24_4_ * 0.0;
  auVar128._28_4_ = 0;
  auVar106 = vpminsd_avx2(auVar115,auVar159);
  auVar105 = vpminsd_avx2(auVar109,auVar156);
  auVar106 = vmaxps_avx(auVar106,auVar105);
  auVar105 = vpminsd_avx2(auVar111,auVar128);
  uVar146 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar117._4_4_ = uVar146;
  auVar117._0_4_ = uVar146;
  auVar117._8_4_ = uVar146;
  auVar117._12_4_ = uVar146;
  auVar117._16_4_ = uVar146;
  auVar117._20_4_ = uVar146;
  auVar117._24_4_ = uVar146;
  auVar117._28_4_ = uVar146;
  auVar105 = vmaxps_avx512vl(auVar105,auVar117);
  auVar106 = vmaxps_avx(auVar106,auVar105);
  auVar105._8_4_ = 0x3f7ffffa;
  auVar105._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar105._12_4_ = 0x3f7ffffa;
  auVar105._16_4_ = 0x3f7ffffa;
  auVar105._20_4_ = 0x3f7ffffa;
  auVar105._24_4_ = 0x3f7ffffa;
  auVar105._28_4_ = 0x3f7ffffa;
  local_80 = vmulps_avx512vl(auVar106,auVar105);
  auVar106 = vpmaxsd_avx2(auVar115,auVar159);
  auVar105 = vpmaxsd_avx2(auVar109,auVar156);
  auVar106 = vminps_avx(auVar106,auVar105);
  auVar105 = vpmaxsd_avx2(auVar111,auVar128);
  uVar146 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar116._4_4_ = uVar146;
  auVar116._0_4_ = uVar146;
  auVar116._8_4_ = uVar146;
  auVar116._12_4_ = uVar146;
  auVar116._16_4_ = uVar146;
  auVar116._20_4_ = uVar146;
  auVar116._24_4_ = uVar146;
  auVar116._28_4_ = uVar146;
  auVar105 = vminps_avx512vl(auVar105,auVar116);
  auVar106 = vminps_avx(auVar106,auVar105);
  auVar107._8_4_ = 0x3f800003;
  auVar107._0_8_ = 0x3f8000033f800003;
  auVar107._12_4_ = 0x3f800003;
  auVar107._16_4_ = 0x3f800003;
  auVar107._20_4_ = 0x3f800003;
  auVar107._24_4_ = 0x3f800003;
  auVar107._28_4_ = 0x3f800003;
  auVar106 = vmulps_avx512vl(auVar106,auVar107);
  auVar105 = vpbroadcastd_avx512vl();
  uVar24 = vpcmpgtd_avx512vl(auVar105,_DAT_0205a920);
  uVar147 = vcmpps_avx512vl(local_80,auVar106,2);
  local_6e9 = (byte)((byte)uVar147 & (byte)uVar24) != 0;
  if (local_6e9) {
    uVar84 = (ulong)(byte)((byte)uVar147 & (byte)uVar24);
    local_570 = pre->ray_space + k;
    local_420 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
    local_6a8 = pre;
    local_568 = prim;
    do {
      lVar25 = 0;
      for (uVar92 = uVar84; (uVar92 & 1) == 0; uVar92 = uVar92 >> 1 | 0x8000000000000000) {
        lVar25 = lVar25 + 1;
      }
      local_6b8 = (ulong)*(uint *)(local_568 + 2);
      pGVar88 = (context->scene->geometries).items[local_6b8].ptr;
      local_620._0_8_ = CONCAT44(0,*(uint *)(local_568 + lVar25 * 4 + 6));
      uVar92 = (ulong)*(uint *)(*(long *)&pGVar88->field_0x58 +
                               CONCAT44(0,*(uint *)(local_568 + lVar25 * 4 + 6)) *
                               pGVar88[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      fVar168 = (pGVar88->time_range).lower;
      fVar168 = pGVar88->fnumTimeSegments *
                ((*(float *)(ray + k * 4 + 0x70) - fVar168) /
                ((pGVar88->time_range).upper - fVar168));
      auVar94 = vroundss_avx(ZEXT416((uint)fVar168),ZEXT416((uint)fVar168),9);
      auVar94 = vminss_avx(auVar94,ZEXT416((uint)(pGVar88->fnumTimeSegments + -1.0)));
      auVar94 = vmaxss_avx(ZEXT816(0) << 0x20,auVar94);
      fVar168 = fVar168 - auVar94._0_4_;
      _Var14 = pGVar88[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar86 = (long)(int)auVar94._0_4_ * 0x38;
      lVar25 = *(long *)(_Var14 + 0x10 + lVar86);
      lVar91 = *(long *)(_Var14 + 0x38 + lVar86);
      lVar15 = *(long *)(_Var14 + 0x48 + lVar86);
      auVar98._4_4_ = fVar168;
      auVar98._0_4_ = fVar168;
      auVar98._8_4_ = fVar168;
      auVar98._12_4_ = fVar168;
      pfVar3 = (float *)(lVar91 + uVar92 * lVar15);
      auVar185._0_4_ = fVar168 * *pfVar3;
      auVar185._4_4_ = fVar168 * pfVar3[1];
      auVar185._8_4_ = fVar168 * pfVar3[2];
      auVar185._12_4_ = fVar168 * pfVar3[3];
      pfVar3 = (float *)(lVar91 + (uVar92 + 1) * lVar15);
      auVar188._0_4_ = fVar168 * *pfVar3;
      auVar188._4_4_ = fVar168 * pfVar3[1];
      auVar188._8_4_ = fVar168 * pfVar3[2];
      auVar188._12_4_ = fVar168 * pfVar3[3];
      auVar94 = vmulps_avx512vl(auVar98,*(undefined1 (*) [16])(lVar91 + (uVar92 + 2) * lVar15));
      auVar95 = vmulps_avx512vl(auVar98,*(undefined1 (*) [16])(lVar91 + lVar15 * (uVar92 + 3)));
      lVar91 = *(long *)(_Var14 + lVar86);
      fVar168 = 1.0 - fVar168;
      auVar97._4_4_ = fVar168;
      auVar97._0_4_ = fVar168;
      auVar97._8_4_ = fVar168;
      auVar97._12_4_ = fVar168;
      local_610 = vfmadd231ps_fma(auVar185,auVar97,*(undefined1 (*) [16])(lVar91 + lVar25 * uVar92))
      ;
      local_3f0 = vfmadd231ps_fma(auVar188,auVar97,
                                  *(undefined1 (*) [16])(lVar91 + lVar25 * (uVar92 + 1)));
      local_400 = vfmadd231ps_avx512vl
                            (auVar94,auVar97,*(undefined1 (*) [16])(lVar91 + lVar25 * (uVar92 + 2)))
      ;
      local_410 = vfmadd231ps_avx512vl
                            (auVar95,auVar97,*(undefined1 (*) [16])(lVar91 + lVar25 * (uVar92 + 3)))
      ;
      iVar13 = (int)pGVar88[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar94 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10))
                              ,0x1c);
      lVar25 = (long)iVar13 * 0x44;
      auVar94 = vinsertps_avx(auVar94,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
      auVar96 = vsubps_avx(local_610,auVar94);
      uVar146 = auVar96._0_4_;
      auVar99._4_4_ = uVar146;
      auVar99._0_4_ = uVar146;
      auVar99._8_4_ = uVar146;
      auVar99._12_4_ = uVar146;
      auVar95 = vshufps_avx(auVar96,auVar96,0x55);
      aVar4 = (local_570->vx).field_0;
      aVar5 = (local_570->vy).field_0;
      fVar168 = (local_570->vz).field_0.m128[0];
      fVar145 = *(float *)((long)&(local_570->vz).field_0 + 4);
      fVar167 = *(float *)((long)&(local_570->vz).field_0 + 8);
      fVar173 = *(float *)((long)&(local_570->vz).field_0 + 0xc);
      auVar96 = vshufps_avx(auVar96,auVar96,0xaa);
      auVar190._0_4_ = fVar168 * auVar96._0_4_;
      auVar190._4_4_ = fVar145 * auVar96._4_4_;
      auVar190._8_4_ = fVar167 * auVar96._8_4_;
      auVar190._12_4_ = fVar173 * auVar96._12_4_;
      auVar95 = vfmadd231ps_fma(auVar190,(undefined1  [16])aVar5,auVar95);
      auVar6 = vfmadd231ps_fma(auVar95,(undefined1  [16])aVar4,auVar99);
      auVar96 = vsubps_avx(local_3f0,auVar94);
      uVar146 = auVar96._0_4_;
      auVar157._4_4_ = uVar146;
      auVar157._0_4_ = uVar146;
      auVar157._8_4_ = uVar146;
      auVar157._12_4_ = uVar146;
      auVar95 = vshufps_avx(auVar96,auVar96,0x55);
      auVar96 = vshufps_avx(auVar96,auVar96,0xaa);
      auVar191._0_4_ = fVar168 * auVar96._0_4_;
      auVar191._4_4_ = fVar145 * auVar96._4_4_;
      auVar191._8_4_ = fVar167 * auVar96._8_4_;
      auVar191._12_4_ = fVar173 * auVar96._12_4_;
      auVar95 = vfmadd231ps_fma(auVar191,(undefined1  [16])aVar5,auVar95);
      auVar7 = vfmadd231ps_fma(auVar95,(undefined1  [16])aVar4,auVar157);
      auVar96 = vsubps_avx512vl(local_400,auVar94);
      uVar146 = auVar96._0_4_;
      auVar158._4_4_ = uVar146;
      auVar158._0_4_ = uVar146;
      auVar158._8_4_ = uVar146;
      auVar158._12_4_ = uVar146;
      auVar95 = vshufps_avx(auVar96,auVar96,0x55);
      auVar96 = vshufps_avx(auVar96,auVar96,0xaa);
      auVar192._0_4_ = fVar168 * auVar96._0_4_;
      auVar192._4_4_ = fVar145 * auVar96._4_4_;
      auVar192._8_4_ = fVar167 * auVar96._8_4_;
      auVar192._12_4_ = fVar173 * auVar96._12_4_;
      auVar95 = vfmadd231ps_fma(auVar192,(undefined1  [16])aVar5,auVar95);
      auVar96 = vfmadd231ps_fma(auVar95,(undefined1  [16])aVar4,auVar158);
      auVar95 = vsubps_avx512vl(local_410,auVar94);
      uVar146 = auVar95._0_4_;
      auVar155._4_4_ = uVar146;
      auVar155._0_4_ = uVar146;
      auVar155._8_4_ = uVar146;
      auVar155._12_4_ = uVar146;
      auVar94 = vshufps_avx(auVar95,auVar95,0x55);
      auVar95 = vshufps_avx(auVar95,auVar95,0xaa);
      auVar196._0_4_ = fVar168 * auVar95._0_4_;
      auVar196._4_4_ = fVar145 * auVar95._4_4_;
      auVar196._8_4_ = fVar167 * auVar95._8_4_;
      auVar196._12_4_ = fVar173 * auVar95._12_4_;
      auVar94 = vfmadd231ps_fma(auVar196,(undefined1  [16])aVar5,auVar94);
      auVar8 = vfmadd231ps_fma(auVar94,(undefined1  [16])aVar4,auVar155);
      auVar106 = *(undefined1 (*) [32])(bezier_basis0 + lVar25);
      uVar146 = auVar6._0_4_;
      local_440._4_4_ = uVar146;
      local_440._0_4_ = uVar146;
      local_440._8_4_ = uVar146;
      local_440._12_4_ = uVar146;
      local_440._16_4_ = uVar146;
      local_440._20_4_ = uVar146;
      local_440._24_4_ = uVar146;
      local_440._28_4_ = uVar146;
      auVar105 = *(undefined1 (*) [32])(bezier_basis0 + lVar25 + 0x484);
      auVar152._8_4_ = 1;
      auVar152._0_8_ = 0x100000001;
      auVar152._12_4_ = 1;
      auVar152._16_4_ = 1;
      auVar152._20_4_ = 1;
      auVar152._24_4_ = 1;
      auVar152._28_4_ = 1;
      local_3e0 = vpermps_avx2(auVar152,ZEXT1632(auVar6));
      local_460 = vbroadcastss_avx512vl(auVar7);
      local_480 = vpermps_avx512vl(auVar152,ZEXT1632(auVar7));
      auVar117 = *(undefined1 (*) [32])(bezier_basis0 + lVar25 + 0x908);
      local_5c0 = vbroadcastss_avx512vl(auVar96);
      local_4c0 = vpermps_avx512vl(auVar152,ZEXT1632(auVar96));
      auVar116 = *(undefined1 (*) [32])(bezier_basis0 + lVar25 + 0xd8c);
      local_4e0 = vbroadcastss_avx512vl(auVar8);
      auVar207 = ZEXT3264(local_4e0);
      local_500 = vpermps_avx512vl(auVar152,ZEXT1632(auVar8));
      auVar208 = ZEXT3264(local_500);
      auVar107 = vmulps_avx512vl(local_4e0,auVar116);
      auVar108 = vmulps_avx512vl(local_500,auVar116);
      auVar107 = vfmadd231ps_avx512vl(auVar107,auVar117,local_5c0);
      auVar108 = vfmadd231ps_avx512vl(auVar108,auVar117,local_4c0);
      auVar107 = vfmadd231ps_avx512vl(auVar107,auVar105,local_460);
      auVar109 = vfmadd231ps_avx512vl(auVar108,auVar105,local_480);
      auVar110 = vfmadd231ps_avx512vl(auVar107,auVar106,local_440);
      auVar107 = *(undefined1 (*) [32])(bezier_basis1 + lVar25);
      auVar108 = *(undefined1 (*) [32])(bezier_basis1 + lVar25 + 0x484);
      auVar115 = *(undefined1 (*) [32])(bezier_basis1 + lVar25 + 0x908);
      auVar104 = vfmadd231ps_avx512vl(auVar109,auVar106,local_3e0);
      auVar109 = *(undefined1 (*) [32])(bezier_basis1 + lVar25 + 0xd8c);
      auVar111 = vmulps_avx512vl(local_4e0,auVar109);
      auVar112 = vmulps_avx512vl(local_500,auVar109);
      auVar111 = vfmadd231ps_avx512vl(auVar111,auVar115,local_5c0);
      auVar112 = vfmadd231ps_avx512vl(auVar112,auVar115,local_4c0);
      auVar111 = vfmadd231ps_avx512vl(auVar111,auVar108,local_460);
      auVar112 = vfmadd231ps_avx512vl(auVar112,auVar108,local_480);
      auVar9 = vfmadd231ps_fma(auVar111,auVar107,local_440);
      auVar10 = vfmadd231ps_fma(auVar112,auVar107,local_3e0);
      auVar112 = vsubps_avx512vl(ZEXT1632(auVar9),auVar110);
      auVar113 = vsubps_avx512vl(ZEXT1632(auVar10),auVar104);
      auVar111 = vmulps_avx512vl(auVar104,auVar112);
      auVar102 = vmulps_avx512vl(auVar110,auVar113);
      auVar111 = vsubps_avx512vl(auVar111,auVar102);
      auVar94 = vshufps_avx(local_610,local_610,0xff);
      uVar147 = auVar94._0_8_;
      local_a0._8_8_ = uVar147;
      local_a0._0_8_ = uVar147;
      local_a0._16_8_ = uVar147;
      local_a0._24_8_ = uVar147;
      auVar94 = vshufps_avx(local_3f0,local_3f0,0xff);
      local_c0 = vbroadcastsd_avx512vl(auVar94);
      auVar94 = vshufps_avx512vl(local_400,local_400,0xff);
      local_e0 = vbroadcastsd_avx512vl(auVar94);
      auVar94 = vshufps_avx512vl(local_410,local_410,0xff);
      uVar147 = auVar94._0_8_;
      register0x00001248 = uVar147;
      local_100 = uVar147;
      register0x00001250 = uVar147;
      register0x00001258 = uVar147;
      auVar102 = vmulps_avx512vl(_local_100,auVar116);
      auVar102 = vfmadd231ps_avx512vl(auVar102,auVar117,local_e0);
      auVar102 = vfmadd231ps_avx512vl(auVar102,auVar105,local_c0);
      auVar102 = vfmadd231ps_avx512vl(auVar102,auVar106,local_a0);
      auVar103 = vmulps_avx512vl(_local_100,auVar109);
      auVar103 = vfmadd231ps_avx512vl(auVar103,auVar115,local_e0);
      auVar103 = vfmadd231ps_avx512vl(auVar103,auVar108,local_c0);
      auVar11 = vfmadd231ps_fma(auVar103,auVar107,local_a0);
      auVar103 = vmulps_avx512vl(auVar113,auVar113);
      auVar103 = vfmadd231ps_avx512vl(auVar103,auVar112,auVar112);
      auVar114 = vmaxps_avx512vl(auVar102,ZEXT1632(auVar11));
      auVar114 = vmulps_avx512vl(auVar114,auVar114);
      auVar103 = vmulps_avx512vl(auVar114,auVar103);
      auVar111 = vmulps_avx512vl(auVar111,auVar111);
      uVar147 = vcmpps_avx512vl(auVar111,auVar103,2);
      auVar94 = vblendps_avx(auVar6,local_610,8);
      auVar97 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar95 = vandps_avx512vl(auVar94,auVar97);
      auVar94 = vblendps_avx(auVar7,local_3f0,8);
      auVar94 = vandps_avx512vl(auVar94,auVar97);
      auVar95 = vmaxps_avx(auVar95,auVar94);
      auVar94 = vblendps_avx(auVar96,local_400,8);
      auVar98 = vandps_avx512vl(auVar94,auVar97);
      auVar94 = vblendps_avx(auVar8,local_410,8);
      auVar94 = vandps_avx512vl(auVar94,auVar97);
      auVar94 = vmaxps_avx(auVar98,auVar94);
      auVar94 = vmaxps_avx(auVar95,auVar94);
      auVar95 = vmovshdup_avx(auVar94);
      auVar95 = vmaxss_avx(auVar95,auVar94);
      auVar94 = vshufpd_avx(auVar94,auVar94,1);
      auVar94 = vmaxss_avx(auVar94,auVar95);
      local_630 = vcvtsi2ss_avx512f(local_400,iVar13);
      auVar187._0_4_ = local_630._0_4_;
      auVar187._4_4_ = auVar187._0_4_;
      auVar187._8_4_ = auVar187._0_4_;
      auVar187._12_4_ = auVar187._0_4_;
      auVar187._16_4_ = auVar187._0_4_;
      auVar187._20_4_ = auVar187._0_4_;
      auVar187._24_4_ = auVar187._0_4_;
      auVar187._28_4_ = auVar187._0_4_;
      uVar24 = vcmpps_avx512vl(auVar187,_DAT_02020f40,0xe);
      local_230 = (byte)uVar147 & (byte)uVar24;
      fVar145 = auVar94._0_4_ * 4.7683716e-07;
      auVar164._8_4_ = 2;
      auVar164._0_8_ = 0x200000002;
      auVar164._12_4_ = 2;
      auVar164._16_4_ = 2;
      auVar164._20_4_ = 2;
      auVar164._24_4_ = 2;
      auVar164._28_4_ = 2;
      local_120 = vpermps_avx512vl(auVar164,ZEXT1632(auVar6));
      local_140 = vpermps_avx512vl(auVar164,ZEXT1632(auVar7));
      local_160 = vpermps_avx512vl(auVar164,ZEXT1632(auVar96));
      auVar111 = vpermps_avx2(auVar164,ZEXT1632(auVar8));
      fVar168 = *(float *)(ray + k * 4 + 0x30);
      auVar94 = auVar113._0_16_;
      _local_670 = ZEXT416((uint)fVar145);
      if (local_230 == 0) {
        bVar89 = false;
        auVar94 = vxorps_avx512vl(auVar94,auVar94);
        auVar205 = ZEXT1664(auVar94);
        auVar202 = ZEXT3264(local_440);
        auVar203 = ZEXT3264(local_3e0);
        auVar204 = ZEXT3264(local_460);
        auVar201 = ZEXT3264(local_480);
        auVar209 = ZEXT3264(local_5c0);
        auVar206 = ZEXT3264(local_4c0);
      }
      else {
        fStack_51c = 0.0;
        fStack_518 = 0.0;
        fStack_514 = 0.0;
        auVar109 = vmulps_avx512vl(auVar111,auVar109);
        auVar115 = vfmadd213ps_avx512vl(auVar115,local_160,auVar109);
        auVar108 = vfmadd213ps_avx512vl(auVar108,local_140,auVar115);
        auVar108 = vfmadd213ps_avx512vl(auVar107,local_120,auVar108);
        auVar116 = vmulps_avx512vl(auVar111,auVar116);
        auVar117 = vfmadd213ps_avx512vl(auVar117,local_160,auVar116);
        auVar115 = vfmadd213ps_avx512vl(auVar105,local_140,auVar117);
        auVar105 = *(undefined1 (*) [32])(bezier_basis0 + lVar25 + 0x1210);
        auVar117 = *(undefined1 (*) [32])(bezier_basis0 + lVar25 + 0x1694);
        auVar116 = *(undefined1 (*) [32])(bezier_basis0 + lVar25 + 0x1b18);
        auVar107 = *(undefined1 (*) [32])(bezier_basis0 + lVar25 + 0x1f9c);
        auVar115 = vfmadd213ps_avx512vl(auVar106,local_120,auVar115);
        auVar106 = vmulps_avx512vl(local_4e0,auVar107);
        auVar109 = vmulps_avx512vl(local_500,auVar107);
        auVar193._0_4_ = auVar111._0_4_ * auVar107._0_4_;
        auVar193._4_4_ = auVar111._4_4_ * auVar107._4_4_;
        auVar193._8_4_ = auVar111._8_4_ * auVar107._8_4_;
        auVar193._12_4_ = auVar111._12_4_ * auVar107._12_4_;
        auVar193._16_4_ = auVar111._16_4_ * auVar107._16_4_;
        auVar193._20_4_ = auVar111._20_4_ * auVar107._20_4_;
        auVar193._24_4_ = auVar111._24_4_ * auVar107._24_4_;
        auVar193._28_4_ = 0;
        auVar209 = ZEXT3264(local_5c0);
        auVar106 = vfmadd231ps_avx512vl(auVar106,auVar116,local_5c0);
        auVar107 = vfmadd231ps_avx512vl(auVar109,auVar116,local_4c0);
        auVar116 = vfmadd231ps_avx512vl(auVar193,local_160,auVar116);
        auVar106 = vfmadd231ps_avx512vl(auVar106,auVar117,local_460);
        auVar107 = vfmadd231ps_avx512vl(auVar107,auVar117,local_480);
        auVar109 = vfmadd231ps_avx512vl(auVar116,local_140,auVar117);
        auVar103 = vfmadd231ps_avx512vl(auVar106,auVar105,local_440);
        auVar107 = vfmadd231ps_avx512vl(auVar107,auVar105,local_3e0);
        auVar106 = *(undefined1 (*) [32])(bezier_basis1 + lVar25 + 0x1210);
        auVar117 = *(undefined1 (*) [32])(bezier_basis1 + lVar25 + 0x1b18);
        auVar116 = *(undefined1 (*) [32])(bezier_basis1 + lVar25 + 0x1f9c);
        auVar109 = vfmadd231ps_avx512vl(auVar109,local_120,auVar105);
        auVar105 = vmulps_avx512vl(local_4e0,auVar116);
        auVar114 = vmulps_avx512vl(local_500,auVar116);
        auVar35._4_4_ = auVar111._4_4_ * auVar116._4_4_;
        auVar35._0_4_ = auVar111._0_4_ * auVar116._0_4_;
        auVar35._8_4_ = auVar111._8_4_ * auVar116._8_4_;
        auVar35._12_4_ = auVar111._12_4_ * auVar116._12_4_;
        auVar35._16_4_ = auVar111._16_4_ * auVar116._16_4_;
        auVar35._20_4_ = auVar111._20_4_ * auVar116._20_4_;
        auVar35._24_4_ = auVar111._24_4_ * auVar116._24_4_;
        auVar35._28_4_ = auVar116._28_4_;
        auVar116 = vfmadd231ps_avx512vl(auVar105,auVar117,local_5c0);
        auVar114 = vfmadd231ps_avx512vl(auVar114,auVar117,local_4c0);
        auVar117 = vfmadd231ps_avx512vl(auVar35,local_160,auVar117);
        auVar105 = *(undefined1 (*) [32])(bezier_basis1 + lVar25 + 0x1694);
        auVar116 = vfmadd231ps_avx512vl(auVar116,auVar105,local_460);
        auVar114 = vfmadd231ps_avx512vl(auVar114,auVar105,local_480);
        auVar105 = vfmadd231ps_avx512vl(auVar117,local_140,auVar105);
        auVar117 = vfmadd231ps_avx512vl(auVar116,auVar106,local_440);
        auVar116 = vfmadd231ps_avx512vl(auVar114,auVar106,local_3e0);
        auVar114 = vfmadd231ps_avx512vl(auVar105,local_120,auVar106);
        auVar198._8_4_ = 0x7fffffff;
        auVar198._0_8_ = 0x7fffffff7fffffff;
        auVar198._12_4_ = 0x7fffffff;
        auVar198._16_4_ = 0x7fffffff;
        auVar198._20_4_ = 0x7fffffff;
        auVar198._24_4_ = 0x7fffffff;
        auVar198._28_4_ = 0x7fffffff;
        auVar106 = vandps_avx(auVar103,auVar198);
        auVar105 = vandps_avx(auVar107,auVar198);
        auVar105 = vmaxps_avx(auVar106,auVar105);
        auVar106 = vandps_avx(auVar109,auVar198);
        auVar106 = vmaxps_avx(auVar105,auVar106);
        auVar109 = vbroadcastss_avx512vl(_local_670);
        uVar92 = vcmpps_avx512vl(auVar106,auVar109,1);
        bVar89 = (bool)((byte)uVar92 & 1);
        auVar118._0_4_ = (float)((uint)bVar89 * auVar112._0_4_ | (uint)!bVar89 * auVar103._0_4_);
        bVar89 = (bool)((byte)(uVar92 >> 1) & 1);
        auVar118._4_4_ = (float)((uint)bVar89 * auVar112._4_4_ | (uint)!bVar89 * auVar103._4_4_);
        bVar89 = (bool)((byte)(uVar92 >> 2) & 1);
        auVar118._8_4_ = (float)((uint)bVar89 * auVar112._8_4_ | (uint)!bVar89 * auVar103._8_4_);
        bVar89 = (bool)((byte)(uVar92 >> 3) & 1);
        auVar118._12_4_ = (float)((uint)bVar89 * auVar112._12_4_ | (uint)!bVar89 * auVar103._12_4_);
        bVar89 = (bool)((byte)(uVar92 >> 4) & 1);
        auVar118._16_4_ = (float)((uint)bVar89 * auVar112._16_4_ | (uint)!bVar89 * auVar103._16_4_);
        bVar89 = (bool)((byte)(uVar92 >> 5) & 1);
        auVar118._20_4_ = (float)((uint)bVar89 * auVar112._20_4_ | (uint)!bVar89 * auVar103._20_4_);
        bVar89 = (bool)((byte)(uVar92 >> 6) & 1);
        auVar118._24_4_ = (float)((uint)bVar89 * auVar112._24_4_ | (uint)!bVar89 * auVar103._24_4_);
        bVar89 = SUB81(uVar92 >> 7,0);
        auVar118._28_4_ = (uint)bVar89 * auVar112._28_4_ | (uint)!bVar89 * auVar103._28_4_;
        bVar89 = (bool)((byte)uVar92 & 1);
        auVar119._0_4_ = (float)((uint)bVar89 * auVar113._0_4_ | (uint)!bVar89 * auVar107._0_4_);
        bVar89 = (bool)((byte)(uVar92 >> 1) & 1);
        auVar119._4_4_ = (float)((uint)bVar89 * auVar113._4_4_ | (uint)!bVar89 * auVar107._4_4_);
        bVar89 = (bool)((byte)(uVar92 >> 2) & 1);
        auVar119._8_4_ = (float)((uint)bVar89 * auVar113._8_4_ | (uint)!bVar89 * auVar107._8_4_);
        bVar89 = (bool)((byte)(uVar92 >> 3) & 1);
        auVar119._12_4_ = (float)((uint)bVar89 * auVar113._12_4_ | (uint)!bVar89 * auVar107._12_4_);
        bVar89 = (bool)((byte)(uVar92 >> 4) & 1);
        auVar119._16_4_ = (float)((uint)bVar89 * auVar113._16_4_ | (uint)!bVar89 * auVar107._16_4_);
        bVar89 = (bool)((byte)(uVar92 >> 5) & 1);
        auVar119._20_4_ = (float)((uint)bVar89 * auVar113._20_4_ | (uint)!bVar89 * auVar107._20_4_);
        bVar89 = (bool)((byte)(uVar92 >> 6) & 1);
        auVar119._24_4_ = (float)((uint)bVar89 * auVar113._24_4_ | (uint)!bVar89 * auVar107._24_4_);
        bVar89 = SUB81(uVar92 >> 7,0);
        auVar119._28_4_ = (uint)bVar89 * auVar113._28_4_ | (uint)!bVar89 * auVar107._28_4_;
        auVar106 = vandps_avx(auVar198,auVar117);
        auVar105 = vandps_avx(auVar116,auVar198);
        auVar105 = vmaxps_avx(auVar106,auVar105);
        auVar106 = vandps_avx(auVar114,auVar198);
        auVar106 = vmaxps_avx(auVar105,auVar106);
        uVar92 = vcmpps_avx512vl(auVar106,auVar109,1);
        bVar89 = (bool)((byte)uVar92 & 1);
        auVar120._0_4_ = (float)((uint)bVar89 * auVar112._0_4_ | (uint)!bVar89 * auVar117._0_4_);
        bVar89 = (bool)((byte)(uVar92 >> 1) & 1);
        auVar120._4_4_ = (float)((uint)bVar89 * auVar112._4_4_ | (uint)!bVar89 * auVar117._4_4_);
        bVar89 = (bool)((byte)(uVar92 >> 2) & 1);
        auVar120._8_4_ = (float)((uint)bVar89 * auVar112._8_4_ | (uint)!bVar89 * auVar117._8_4_);
        bVar89 = (bool)((byte)(uVar92 >> 3) & 1);
        auVar120._12_4_ = (float)((uint)bVar89 * auVar112._12_4_ | (uint)!bVar89 * auVar117._12_4_);
        bVar89 = (bool)((byte)(uVar92 >> 4) & 1);
        auVar120._16_4_ = (float)((uint)bVar89 * auVar112._16_4_ | (uint)!bVar89 * auVar117._16_4_);
        bVar89 = (bool)((byte)(uVar92 >> 5) & 1);
        auVar120._20_4_ = (float)((uint)bVar89 * auVar112._20_4_ | (uint)!bVar89 * auVar117._20_4_);
        bVar89 = (bool)((byte)(uVar92 >> 6) & 1);
        auVar120._24_4_ = (float)((uint)bVar89 * auVar112._24_4_ | (uint)!bVar89 * auVar117._24_4_);
        bVar89 = SUB81(uVar92 >> 7,0);
        auVar120._28_4_ = (uint)bVar89 * auVar112._28_4_ | (uint)!bVar89 * auVar117._28_4_;
        bVar89 = (bool)((byte)uVar92 & 1);
        auVar121._0_4_ = (float)((uint)bVar89 * auVar113._0_4_ | (uint)!bVar89 * auVar116._0_4_);
        bVar89 = (bool)((byte)(uVar92 >> 1) & 1);
        auVar121._4_4_ = (float)((uint)bVar89 * auVar113._4_4_ | (uint)!bVar89 * auVar116._4_4_);
        bVar89 = (bool)((byte)(uVar92 >> 2) & 1);
        auVar121._8_4_ = (float)((uint)bVar89 * auVar113._8_4_ | (uint)!bVar89 * auVar116._8_4_);
        bVar89 = (bool)((byte)(uVar92 >> 3) & 1);
        auVar121._12_4_ = (float)((uint)bVar89 * auVar113._12_4_ | (uint)!bVar89 * auVar116._12_4_);
        bVar89 = (bool)((byte)(uVar92 >> 4) & 1);
        auVar121._16_4_ = (float)((uint)bVar89 * auVar113._16_4_ | (uint)!bVar89 * auVar116._16_4_);
        bVar89 = (bool)((byte)(uVar92 >> 5) & 1);
        auVar121._20_4_ = (float)((uint)bVar89 * auVar113._20_4_ | (uint)!bVar89 * auVar116._20_4_);
        bVar89 = (bool)((byte)(uVar92 >> 6) & 1);
        auVar121._24_4_ = (float)((uint)bVar89 * auVar113._24_4_ | (uint)!bVar89 * auVar116._24_4_);
        bVar89 = SUB81(uVar92 >> 7,0);
        auVar121._28_4_ = (uint)bVar89 * auVar113._28_4_ | (uint)!bVar89 * auVar116._28_4_;
        auVar99 = vxorps_avx512vl(auVar94,auVar94);
        auVar205 = ZEXT1664(auVar99);
        auVar106 = vfmadd213ps_avx512vl(auVar118,auVar118,ZEXT1632(auVar99));
        auVar94 = vfmadd231ps_fma(auVar106,auVar119,auVar119);
        auVar106 = vrsqrt14ps_avx512vl(ZEXT1632(auVar94));
        fVar167 = auVar106._0_4_;
        fVar173 = auVar106._4_4_;
        fVar174 = auVar106._8_4_;
        fVar175 = auVar106._12_4_;
        fVar161 = auVar106._16_4_;
        fVar166 = auVar106._20_4_;
        fVar93 = auVar106._24_4_;
        auVar36._4_4_ = fVar173 * fVar173 * fVar173 * auVar94._4_4_ * -0.5;
        auVar36._0_4_ = fVar167 * fVar167 * fVar167 * auVar94._0_4_ * -0.5;
        auVar36._8_4_ = fVar174 * fVar174 * fVar174 * auVar94._8_4_ * -0.5;
        auVar36._12_4_ = fVar175 * fVar175 * fVar175 * auVar94._12_4_ * -0.5;
        auVar36._16_4_ = fVar161 * fVar161 * fVar161 * -0.0;
        auVar36._20_4_ = fVar166 * fVar166 * fVar166 * -0.0;
        auVar36._24_4_ = fVar93 * fVar93 * fVar93 * -0.0;
        auVar36._28_4_ = auVar114._28_4_;
        auVar105 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar106 = vfmadd231ps_avx512vl(auVar36,auVar105,auVar106);
        auVar37._4_4_ = auVar119._4_4_ * auVar106._4_4_;
        auVar37._0_4_ = auVar119._0_4_ * auVar106._0_4_;
        auVar37._8_4_ = auVar119._8_4_ * auVar106._8_4_;
        auVar37._12_4_ = auVar119._12_4_ * auVar106._12_4_;
        auVar37._16_4_ = auVar119._16_4_ * auVar106._16_4_;
        auVar37._20_4_ = auVar119._20_4_ * auVar106._20_4_;
        auVar37._24_4_ = auVar119._24_4_ * auVar106._24_4_;
        auVar37._28_4_ = 0;
        auVar38._4_4_ = auVar106._4_4_ * -auVar118._4_4_;
        auVar38._0_4_ = auVar106._0_4_ * -auVar118._0_4_;
        auVar38._8_4_ = auVar106._8_4_ * -auVar118._8_4_;
        auVar38._12_4_ = auVar106._12_4_ * -auVar118._12_4_;
        auVar38._16_4_ = auVar106._16_4_ * -auVar118._16_4_;
        auVar38._20_4_ = auVar106._20_4_ * -auVar118._20_4_;
        auVar38._24_4_ = auVar106._24_4_ * -auVar118._24_4_;
        auVar38._28_4_ = auVar119._28_4_;
        auVar106 = vmulps_avx512vl(auVar106,ZEXT1632(auVar99));
        auVar112 = ZEXT1632(auVar99);
        auVar117 = vfmadd213ps_avx512vl(auVar120,auVar120,auVar112);
        auVar94 = vfmadd231ps_fma(auVar117,auVar121,auVar121);
        auVar117 = vrsqrt14ps_avx512vl(ZEXT1632(auVar94));
        fVar167 = auVar117._0_4_;
        fVar173 = auVar117._4_4_;
        fVar174 = auVar117._8_4_;
        fVar175 = auVar117._12_4_;
        fVar161 = auVar117._16_4_;
        fVar166 = auVar117._20_4_;
        fVar93 = auVar117._24_4_;
        auVar39._4_4_ = fVar173 * fVar173 * fVar173 * auVar94._4_4_ * -0.5;
        auVar39._0_4_ = fVar167 * fVar167 * fVar167 * auVar94._0_4_ * -0.5;
        auVar39._8_4_ = fVar174 * fVar174 * fVar174 * auVar94._8_4_ * -0.5;
        auVar39._12_4_ = fVar175 * fVar175 * fVar175 * auVar94._12_4_ * -0.5;
        auVar39._16_4_ = fVar161 * fVar161 * fVar161 * -0.0;
        auVar39._20_4_ = fVar166 * fVar166 * fVar166 * -0.0;
        auVar39._24_4_ = fVar93 * fVar93 * fVar93 * -0.0;
        auVar39._28_4_ = 0;
        auVar105 = vfmadd231ps_avx512vl(auVar39,auVar105,auVar117);
        auVar40._4_4_ = auVar121._4_4_ * auVar105._4_4_;
        auVar40._0_4_ = auVar121._0_4_ * auVar105._0_4_;
        auVar40._8_4_ = auVar121._8_4_ * auVar105._8_4_;
        auVar40._12_4_ = auVar121._12_4_ * auVar105._12_4_;
        auVar40._16_4_ = auVar121._16_4_ * auVar105._16_4_;
        auVar40._20_4_ = auVar121._20_4_ * auVar105._20_4_;
        auVar40._24_4_ = auVar121._24_4_ * auVar105._24_4_;
        auVar40._28_4_ = auVar117._28_4_;
        auVar41._4_4_ = -auVar120._4_4_ * auVar105._4_4_;
        auVar41._0_4_ = -auVar120._0_4_ * auVar105._0_4_;
        auVar41._8_4_ = -auVar120._8_4_ * auVar105._8_4_;
        auVar41._12_4_ = -auVar120._12_4_ * auVar105._12_4_;
        auVar41._16_4_ = -auVar120._16_4_ * auVar105._16_4_;
        auVar41._20_4_ = -auVar120._20_4_ * auVar105._20_4_;
        auVar41._24_4_ = -auVar120._24_4_ * auVar105._24_4_;
        auVar41._28_4_ = auVar120._28_4_ ^ 0x80000000;
        auVar105 = vmulps_avx512vl(auVar105,auVar112);
        auVar94 = vfmadd213ps_fma(auVar37,auVar102,auVar110);
        auVar95 = vfmadd213ps_fma(auVar38,auVar102,auVar104);
        auVar117 = vfmadd213ps_avx512vl(auVar106,auVar102,auVar115);
        auVar116 = vfmadd213ps_avx512vl(auVar40,ZEXT1632(auVar11),ZEXT1632(auVar9));
        auVar97 = vfnmadd213ps_fma(auVar37,auVar102,auVar110);
        auVar109 = ZEXT1632(auVar11);
        auVar96 = vfmadd213ps_fma(auVar41,auVar109,ZEXT1632(auVar10));
        auVar98 = vfnmadd213ps_fma(auVar38,auVar102,auVar104);
        auVar6 = vfmadd213ps_fma(auVar105,auVar109,auVar108);
        auVar107 = vfnmadd231ps_avx512vl(auVar115,auVar102,auVar106);
        auVar9 = vfnmadd213ps_fma(auVar40,auVar109,ZEXT1632(auVar9));
        auVar10 = vfnmadd213ps_fma(auVar41,auVar109,ZEXT1632(auVar10));
        auVar155 = vfnmadd231ps_fma(auVar108,ZEXT1632(auVar11),auVar105);
        auVar105 = vsubps_avx512vl(auVar116,ZEXT1632(auVar97));
        auVar106 = vsubps_avx(ZEXT1632(auVar96),ZEXT1632(auVar98));
        auVar108 = vsubps_avx512vl(ZEXT1632(auVar6),auVar107);
        auVar115 = vmulps_avx512vl(auVar106,auVar107);
        auVar7 = vfmsub231ps_fma(auVar115,ZEXT1632(auVar98),auVar108);
        auVar42._4_4_ = auVar97._4_4_ * auVar108._4_4_;
        auVar42._0_4_ = auVar97._0_4_ * auVar108._0_4_;
        auVar42._8_4_ = auVar97._8_4_ * auVar108._8_4_;
        auVar42._12_4_ = auVar97._12_4_ * auVar108._12_4_;
        auVar42._16_4_ = auVar108._16_4_ * 0.0;
        auVar42._20_4_ = auVar108._20_4_ * 0.0;
        auVar42._24_4_ = auVar108._24_4_ * 0.0;
        auVar42._28_4_ = auVar108._28_4_;
        auVar108 = vfmsub231ps_avx512vl(auVar42,auVar107,auVar105);
        auVar43._4_4_ = auVar98._4_4_ * auVar105._4_4_;
        auVar43._0_4_ = auVar98._0_4_ * auVar105._0_4_;
        auVar43._8_4_ = auVar98._8_4_ * auVar105._8_4_;
        auVar43._12_4_ = auVar98._12_4_ * auVar105._12_4_;
        auVar43._16_4_ = auVar105._16_4_ * 0.0;
        auVar43._20_4_ = auVar105._20_4_ * 0.0;
        auVar43._24_4_ = auVar105._24_4_ * 0.0;
        auVar43._28_4_ = auVar105._28_4_;
        auVar8 = vfmsub231ps_fma(auVar43,ZEXT1632(auVar97),auVar106);
        auVar106 = vfmadd231ps_avx512vl(ZEXT1632(auVar8),auVar112,auVar108);
        auVar106 = vfmadd231ps_avx512vl(auVar106,auVar112,ZEXT1632(auVar7));
        auVar113 = ZEXT1632(auVar99);
        uVar92 = vcmpps_avx512vl(auVar106,auVar113,2);
        bVar83 = (byte)uVar92;
        fVar93 = (float)((uint)(bVar83 & 1) * auVar94._0_4_ |
                        (uint)!(bool)(bVar83 & 1) * auVar9._0_4_);
        bVar89 = (bool)((byte)(uVar92 >> 1) & 1);
        fVar138 = (float)((uint)bVar89 * auVar94._4_4_ | (uint)!bVar89 * auVar9._4_4_);
        bVar89 = (bool)((byte)(uVar92 >> 2) & 1);
        fVar140 = (float)((uint)bVar89 * auVar94._8_4_ | (uint)!bVar89 * auVar9._8_4_);
        bVar89 = (bool)((byte)(uVar92 >> 3) & 1);
        fVar142 = (float)((uint)bVar89 * auVar94._12_4_ | (uint)!bVar89 * auVar9._12_4_);
        auVar115 = ZEXT1632(CONCAT412(fVar142,CONCAT48(fVar140,CONCAT44(fVar138,fVar93))));
        fVar160 = (float)((uint)(bVar83 & 1) * auVar95._0_4_ |
                         (uint)!(bool)(bVar83 & 1) * auVar10._0_4_);
        bVar89 = (bool)((byte)(uVar92 >> 1) & 1);
        fVar139 = (float)((uint)bVar89 * auVar95._4_4_ | (uint)!bVar89 * auVar10._4_4_);
        bVar89 = (bool)((byte)(uVar92 >> 2) & 1);
        fVar141 = (float)((uint)bVar89 * auVar95._8_4_ | (uint)!bVar89 * auVar10._8_4_);
        bVar89 = (bool)((byte)(uVar92 >> 3) & 1);
        fVar143 = (float)((uint)bVar89 * auVar95._12_4_ | (uint)!bVar89 * auVar10._12_4_);
        auVar109 = ZEXT1632(CONCAT412(fVar143,CONCAT48(fVar141,CONCAT44(fVar139,fVar160))));
        auVar122._0_4_ =
             (float)((uint)(bVar83 & 1) * auVar117._0_4_ |
                    (uint)!(bool)(bVar83 & 1) * auVar155._0_4_);
        bVar89 = (bool)((byte)(uVar92 >> 1) & 1);
        auVar122._4_4_ = (float)((uint)bVar89 * auVar117._4_4_ | (uint)!bVar89 * auVar155._4_4_);
        bVar89 = (bool)((byte)(uVar92 >> 2) & 1);
        auVar122._8_4_ = (float)((uint)bVar89 * auVar117._8_4_ | (uint)!bVar89 * auVar155._8_4_);
        bVar89 = (bool)((byte)(uVar92 >> 3) & 1);
        auVar122._12_4_ = (float)((uint)bVar89 * auVar117._12_4_ | (uint)!bVar89 * auVar155._12_4_);
        fVar167 = (float)((uint)((byte)(uVar92 >> 4) & 1) * auVar117._16_4_);
        auVar122._16_4_ = fVar167;
        fVar173 = (float)((uint)((byte)(uVar92 >> 5) & 1) * auVar117._20_4_);
        auVar122._20_4_ = fVar173;
        fVar174 = (float)((uint)((byte)(uVar92 >> 6) & 1) * auVar117._24_4_);
        auVar122._24_4_ = fVar174;
        iVar1 = (uint)(byte)(uVar92 >> 7) * auVar117._28_4_;
        auVar122._28_4_ = iVar1;
        auVar105 = vblendmps_avx512vl(ZEXT1632(auVar97),auVar116);
        auVar123._0_4_ =
             (uint)(bVar83 & 1) * auVar105._0_4_ | (uint)!(bool)(bVar83 & 1) * auVar7._0_4_;
        bVar89 = (bool)((byte)(uVar92 >> 1) & 1);
        auVar123._4_4_ = (uint)bVar89 * auVar105._4_4_ | (uint)!bVar89 * auVar7._4_4_;
        bVar89 = (bool)((byte)(uVar92 >> 2) & 1);
        auVar123._8_4_ = (uint)bVar89 * auVar105._8_4_ | (uint)!bVar89 * auVar7._8_4_;
        bVar89 = (bool)((byte)(uVar92 >> 3) & 1);
        auVar123._12_4_ = (uint)bVar89 * auVar105._12_4_ | (uint)!bVar89 * auVar7._12_4_;
        auVar123._16_4_ = (uint)((byte)(uVar92 >> 4) & 1) * auVar105._16_4_;
        auVar123._20_4_ = (uint)((byte)(uVar92 >> 5) & 1) * auVar105._20_4_;
        auVar123._24_4_ = (uint)((byte)(uVar92 >> 6) & 1) * auVar105._24_4_;
        auVar123._28_4_ = (uint)(byte)(uVar92 >> 7) * auVar105._28_4_;
        auVar105 = vblendmps_avx512vl(ZEXT1632(auVar98),ZEXT1632(auVar96));
        auVar124._0_4_ =
             (float)((uint)(bVar83 & 1) * auVar105._0_4_ | (uint)!(bool)(bVar83 & 1) * auVar95._0_4_
                    );
        bVar89 = (bool)((byte)(uVar92 >> 1) & 1);
        auVar124._4_4_ = (float)((uint)bVar89 * auVar105._4_4_ | (uint)!bVar89 * auVar95._4_4_);
        bVar89 = (bool)((byte)(uVar92 >> 2) & 1);
        auVar124._8_4_ = (float)((uint)bVar89 * auVar105._8_4_ | (uint)!bVar89 * auVar95._8_4_);
        bVar89 = (bool)((byte)(uVar92 >> 3) & 1);
        auVar124._12_4_ = (float)((uint)bVar89 * auVar105._12_4_ | (uint)!bVar89 * auVar95._12_4_);
        fVar175 = (float)((uint)((byte)(uVar92 >> 4) & 1) * auVar105._16_4_);
        auVar124._16_4_ = fVar175;
        fVar161 = (float)((uint)((byte)(uVar92 >> 5) & 1) * auVar105._20_4_);
        auVar124._20_4_ = fVar161;
        fVar166 = (float)((uint)((byte)(uVar92 >> 6) & 1) * auVar105._24_4_);
        auVar124._24_4_ = fVar166;
        auVar124._28_4_ = (uint)(byte)(uVar92 >> 7) * auVar105._28_4_;
        auVar105 = vblendmps_avx512vl(auVar107,ZEXT1632(auVar6));
        auVar125._0_4_ =
             (float)((uint)(bVar83 & 1) * auVar105._0_4_ |
                    (uint)!(bool)(bVar83 & 1) * auVar117._0_4_);
        bVar89 = (bool)((byte)(uVar92 >> 1) & 1);
        auVar125._4_4_ = (float)((uint)bVar89 * auVar105._4_4_ | (uint)!bVar89 * auVar117._4_4_);
        bVar89 = (bool)((byte)(uVar92 >> 2) & 1);
        auVar125._8_4_ = (float)((uint)bVar89 * auVar105._8_4_ | (uint)!bVar89 * auVar117._8_4_);
        bVar89 = (bool)((byte)(uVar92 >> 3) & 1);
        auVar125._12_4_ = (float)((uint)bVar89 * auVar105._12_4_ | (uint)!bVar89 * auVar117._12_4_);
        bVar89 = (bool)((byte)(uVar92 >> 4) & 1);
        auVar125._16_4_ = (float)((uint)bVar89 * auVar105._16_4_ | (uint)!bVar89 * auVar117._16_4_);
        bVar89 = (bool)((byte)(uVar92 >> 5) & 1);
        auVar125._20_4_ = (float)((uint)bVar89 * auVar105._20_4_ | (uint)!bVar89 * auVar117._20_4_);
        bVar89 = (bool)((byte)(uVar92 >> 6) & 1);
        auVar125._24_4_ = (float)((uint)bVar89 * auVar105._24_4_ | (uint)!bVar89 * auVar117._24_4_);
        bVar89 = SUB81(uVar92 >> 7,0);
        auVar125._28_4_ = (uint)bVar89 * auVar105._28_4_ | (uint)!bVar89 * auVar117._28_4_;
        auVar126._0_4_ =
             (uint)(bVar83 & 1) * (int)auVar97._0_4_ | (uint)!(bool)(bVar83 & 1) * auVar116._0_4_;
        bVar89 = (bool)((byte)(uVar92 >> 1) & 1);
        auVar126._4_4_ = (uint)bVar89 * (int)auVar97._4_4_ | (uint)!bVar89 * auVar116._4_4_;
        bVar89 = (bool)((byte)(uVar92 >> 2) & 1);
        auVar126._8_4_ = (uint)bVar89 * (int)auVar97._8_4_ | (uint)!bVar89 * auVar116._8_4_;
        bVar89 = (bool)((byte)(uVar92 >> 3) & 1);
        auVar126._12_4_ = (uint)bVar89 * (int)auVar97._12_4_ | (uint)!bVar89 * auVar116._12_4_;
        auVar126._16_4_ = (uint)!(bool)((byte)(uVar92 >> 4) & 1) * auVar116._16_4_;
        auVar126._20_4_ = (uint)!(bool)((byte)(uVar92 >> 5) & 1) * auVar116._20_4_;
        auVar126._24_4_ = (uint)!(bool)((byte)(uVar92 >> 6) & 1) * auVar116._24_4_;
        auVar126._28_4_ = (uint)!SUB81(uVar92 >> 7,0) * auVar116._28_4_;
        bVar89 = (bool)((byte)(uVar92 >> 1) & 1);
        bVar18 = (bool)((byte)(uVar92 >> 2) & 1);
        bVar19 = (bool)((byte)(uVar92 >> 3) & 1);
        auVar127._0_4_ =
             (uint)(bVar83 & 1) * auVar107._0_4_ | (uint)!(bool)(bVar83 & 1) * auVar6._0_4_;
        bVar17 = (bool)((byte)(uVar92 >> 1) & 1);
        auVar127._4_4_ = (uint)bVar17 * auVar107._4_4_ | (uint)!bVar17 * auVar6._4_4_;
        bVar17 = (bool)((byte)(uVar92 >> 2) & 1);
        auVar127._8_4_ = (uint)bVar17 * auVar107._8_4_ | (uint)!bVar17 * auVar6._8_4_;
        bVar17 = (bool)((byte)(uVar92 >> 3) & 1);
        auVar127._12_4_ = (uint)bVar17 * auVar107._12_4_ | (uint)!bVar17 * auVar6._12_4_;
        auVar127._16_4_ = (uint)((byte)(uVar92 >> 4) & 1) * auVar107._16_4_;
        auVar127._20_4_ = (uint)((byte)(uVar92 >> 5) & 1) * auVar107._20_4_;
        auVar127._24_4_ = (uint)((byte)(uVar92 >> 6) & 1) * auVar107._24_4_;
        iVar2 = (uint)(byte)(uVar92 >> 7) * auVar107._28_4_;
        auVar127._28_4_ = iVar2;
        auVar110 = vsubps_avx512vl(auVar126,auVar115);
        auVar105 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar19 * (int)auVar98._12_4_ |
                                                 (uint)!bVar19 * auVar96._12_4_,
                                                 CONCAT48((uint)bVar18 * (int)auVar98._8_4_ |
                                                          (uint)!bVar18 * auVar96._8_4_,
                                                          CONCAT44((uint)bVar89 * (int)auVar98._4_4_
                                                                   | (uint)!bVar89 * auVar96._4_4_,
                                                                   (uint)(bVar83 & 1) *
                                                                   (int)auVar98._0_4_ |
                                                                   (uint)!(bool)(bVar83 & 1) *
                                                                   auVar96._0_4_)))),auVar109);
        auVar117 = vsubps_avx(auVar127,auVar122);
        auVar116 = vsubps_avx(auVar115,auVar123);
        auVar107 = vsubps_avx(auVar109,auVar124);
        auVar108 = vsubps_avx(auVar122,auVar125);
        auVar44._4_4_ = auVar117._4_4_ * fVar138;
        auVar44._0_4_ = auVar117._0_4_ * fVar93;
        auVar44._8_4_ = auVar117._8_4_ * fVar140;
        auVar44._12_4_ = auVar117._12_4_ * fVar142;
        auVar44._16_4_ = auVar117._16_4_ * 0.0;
        auVar44._20_4_ = auVar117._20_4_ * 0.0;
        auVar44._24_4_ = auVar117._24_4_ * 0.0;
        auVar44._28_4_ = iVar2;
        auVar94 = vfmsub231ps_fma(auVar44,auVar122,auVar110);
        auVar45._4_4_ = fVar139 * auVar110._4_4_;
        auVar45._0_4_ = fVar160 * auVar110._0_4_;
        auVar45._8_4_ = fVar141 * auVar110._8_4_;
        auVar45._12_4_ = fVar143 * auVar110._12_4_;
        auVar45._16_4_ = auVar110._16_4_ * 0.0;
        auVar45._20_4_ = auVar110._20_4_ * 0.0;
        auVar45._24_4_ = auVar110._24_4_ * 0.0;
        auVar45._28_4_ = auVar106._28_4_;
        auVar95 = vfmsub231ps_fma(auVar45,auVar115,auVar105);
        auVar106 = vfmadd231ps_avx512vl(ZEXT1632(auVar95),auVar113,ZEXT1632(auVar94));
        auVar169._0_4_ = auVar105._0_4_ * auVar122._0_4_;
        auVar169._4_4_ = auVar105._4_4_ * auVar122._4_4_;
        auVar169._8_4_ = auVar105._8_4_ * auVar122._8_4_;
        auVar169._12_4_ = auVar105._12_4_ * auVar122._12_4_;
        auVar169._16_4_ = auVar105._16_4_ * fVar167;
        auVar169._20_4_ = auVar105._20_4_ * fVar173;
        auVar169._24_4_ = auVar105._24_4_ * fVar174;
        auVar169._28_4_ = 0;
        auVar94 = vfmsub231ps_fma(auVar169,auVar109,auVar117);
        auVar104 = vfmadd231ps_avx512vl(auVar106,auVar113,ZEXT1632(auVar94));
        auVar106 = vmulps_avx512vl(auVar108,auVar123);
        auVar106 = vfmsub231ps_avx512vl(auVar106,auVar116,auVar125);
        auVar46._4_4_ = auVar107._4_4_ * auVar125._4_4_;
        auVar46._0_4_ = auVar107._0_4_ * auVar125._0_4_;
        auVar46._8_4_ = auVar107._8_4_ * auVar125._8_4_;
        auVar46._12_4_ = auVar107._12_4_ * auVar125._12_4_;
        auVar46._16_4_ = auVar107._16_4_ * auVar125._16_4_;
        auVar46._20_4_ = auVar107._20_4_ * auVar125._20_4_;
        auVar46._24_4_ = auVar107._24_4_ * auVar125._24_4_;
        auVar46._28_4_ = auVar125._28_4_;
        auVar94 = vfmsub231ps_fma(auVar46,auVar124,auVar108);
        auVar170._0_4_ = auVar124._0_4_ * auVar116._0_4_;
        auVar170._4_4_ = auVar124._4_4_ * auVar116._4_4_;
        auVar170._8_4_ = auVar124._8_4_ * auVar116._8_4_;
        auVar170._12_4_ = auVar124._12_4_ * auVar116._12_4_;
        auVar170._16_4_ = fVar175 * auVar116._16_4_;
        auVar170._20_4_ = fVar161 * auVar116._20_4_;
        auVar170._24_4_ = fVar166 * auVar116._24_4_;
        auVar170._28_4_ = 0;
        auVar95 = vfmsub231ps_fma(auVar170,auVar107,auVar123);
        auVar106 = vfmadd231ps_avx512vl(ZEXT1632(auVar95),auVar113,auVar106);
        auVar112 = vfmadd231ps_avx512vl(auVar106,auVar113,ZEXT1632(auVar94));
        auVar106 = vmaxps_avx(auVar104,auVar112);
        uVar147 = vcmpps_avx512vl(auVar106,auVar113,2);
        local_230 = local_230 & (byte)uVar147;
        auVar202 = ZEXT3264(local_440);
        auVar203 = ZEXT3264(local_3e0);
        auVar204 = ZEXT3264(local_460);
        auVar201 = ZEXT3264(local_480);
        auVar195 = ZEXT1664(_local_670);
        if (local_230 == 0) {
          local_230 = 0;
        }
        else {
          auVar47._4_4_ = auVar108._4_4_ * auVar105._4_4_;
          auVar47._0_4_ = auVar108._0_4_ * auVar105._0_4_;
          auVar47._8_4_ = auVar108._8_4_ * auVar105._8_4_;
          auVar47._12_4_ = auVar108._12_4_ * auVar105._12_4_;
          auVar47._16_4_ = auVar108._16_4_ * auVar105._16_4_;
          auVar47._20_4_ = auVar108._20_4_ * auVar105._20_4_;
          auVar47._24_4_ = auVar108._24_4_ * auVar105._24_4_;
          auVar47._28_4_ = auVar106._28_4_;
          auVar96 = vfmsub231ps_fma(auVar47,auVar107,auVar117);
          auVar48._4_4_ = auVar117._4_4_ * auVar116._4_4_;
          auVar48._0_4_ = auVar117._0_4_ * auVar116._0_4_;
          auVar48._8_4_ = auVar117._8_4_ * auVar116._8_4_;
          auVar48._12_4_ = auVar117._12_4_ * auVar116._12_4_;
          auVar48._16_4_ = auVar117._16_4_ * auVar116._16_4_;
          auVar48._20_4_ = auVar117._20_4_ * auVar116._20_4_;
          auVar48._24_4_ = auVar117._24_4_ * auVar116._24_4_;
          auVar48._28_4_ = auVar117._28_4_;
          auVar95 = vfmsub231ps_fma(auVar48,auVar110,auVar108);
          auVar49._4_4_ = auVar107._4_4_ * auVar110._4_4_;
          auVar49._0_4_ = auVar107._0_4_ * auVar110._0_4_;
          auVar49._8_4_ = auVar107._8_4_ * auVar110._8_4_;
          auVar49._12_4_ = auVar107._12_4_ * auVar110._12_4_;
          auVar49._16_4_ = auVar107._16_4_ * auVar110._16_4_;
          auVar49._20_4_ = auVar107._20_4_ * auVar110._20_4_;
          auVar49._24_4_ = auVar107._24_4_ * auVar110._24_4_;
          auVar49._28_4_ = auVar107._28_4_;
          auVar6 = vfmsub231ps_fma(auVar49,auVar116,auVar105);
          auVar94 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar95),ZEXT1632(auVar6));
          auVar106 = vfmadd231ps_avx512vl(ZEXT1632(auVar94),ZEXT1632(auVar96),auVar113);
          auVar105 = vrcp14ps_avx512vl(auVar106);
          auVar26._8_4_ = 0x3f800000;
          auVar26._0_8_ = &DAT_3f8000003f800000;
          auVar26._12_4_ = 0x3f800000;
          auVar26._16_4_ = 0x3f800000;
          auVar26._20_4_ = 0x3f800000;
          auVar26._24_4_ = 0x3f800000;
          auVar26._28_4_ = 0x3f800000;
          auVar117 = vfnmadd213ps_avx512vl(auVar105,auVar106,auVar26);
          auVar94 = vfmadd132ps_fma(auVar117,auVar105,auVar105);
          auVar50._4_4_ = auVar6._4_4_ * auVar122._4_4_;
          auVar50._0_4_ = auVar6._0_4_ * auVar122._0_4_;
          auVar50._8_4_ = auVar6._8_4_ * auVar122._8_4_;
          auVar50._12_4_ = auVar6._12_4_ * auVar122._12_4_;
          auVar50._16_4_ = fVar167 * 0.0;
          auVar50._20_4_ = fVar173 * 0.0;
          auVar50._24_4_ = fVar174 * 0.0;
          auVar50._28_4_ = iVar1;
          auVar95 = vfmadd231ps_fma(auVar50,auVar109,ZEXT1632(auVar95));
          auVar95 = vfmadd231ps_fma(ZEXT1632(auVar95),auVar115,ZEXT1632(auVar96));
          fVar167 = auVar94._0_4_;
          fVar173 = auVar94._4_4_;
          fVar174 = auVar94._8_4_;
          fVar175 = auVar94._12_4_;
          auVar105 = ZEXT1632(CONCAT412(auVar95._12_4_ * fVar175,
                                        CONCAT48(auVar95._8_4_ * fVar174,
                                                 CONCAT44(auVar95._4_4_ * fVar173,
                                                          auVar95._0_4_ * fVar167))));
          auVar184._4_4_ = fVar168;
          auVar184._0_4_ = fVar168;
          auVar184._8_4_ = fVar168;
          auVar184._12_4_ = fVar168;
          auVar184._16_4_ = fVar168;
          auVar184._20_4_ = fVar168;
          auVar184._24_4_ = fVar168;
          auVar184._28_4_ = fVar168;
          uVar147 = vcmpps_avx512vl(auVar184,auVar105,2);
          uVar146 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar27._4_4_ = uVar146;
          auVar27._0_4_ = uVar146;
          auVar27._8_4_ = uVar146;
          auVar27._12_4_ = uVar146;
          auVar27._16_4_ = uVar146;
          auVar27._20_4_ = uVar146;
          auVar27._24_4_ = uVar146;
          auVar27._28_4_ = uVar146;
          uVar24 = vcmpps_avx512vl(auVar105,auVar27,2);
          local_230 = (byte)uVar147 & (byte)uVar24 & local_230;
          if (local_230 != 0) {
            uVar147 = vcmpps_avx512vl(auVar106,auVar113,4);
            if ((local_230 & (byte)uVar147) != 0) {
              local_230 = local_230 & (byte)uVar147;
              fVar161 = auVar104._0_4_ * fVar167;
              fVar166 = auVar104._4_4_ * fVar173;
              auVar51._4_4_ = fVar166;
              auVar51._0_4_ = fVar161;
              fVar93 = auVar104._8_4_ * fVar174;
              auVar51._8_4_ = fVar93;
              fVar160 = auVar104._12_4_ * fVar175;
              auVar51._12_4_ = fVar160;
              fVar138 = auVar104._16_4_ * 0.0;
              auVar51._16_4_ = fVar138;
              fVar139 = auVar104._20_4_ * 0.0;
              auVar51._20_4_ = fVar139;
              fVar140 = auVar104._24_4_ * 0.0;
              auVar51._24_4_ = fVar140;
              auVar51._28_4_ = auVar104._28_4_;
              fVar167 = auVar112._0_4_ * fVar167;
              fVar173 = auVar112._4_4_ * fVar173;
              auVar52._4_4_ = fVar173;
              auVar52._0_4_ = fVar167;
              fVar174 = auVar112._8_4_ * fVar174;
              auVar52._8_4_ = fVar174;
              fVar175 = auVar112._12_4_ * fVar175;
              auVar52._12_4_ = fVar175;
              fVar141 = auVar112._16_4_ * 0.0;
              auVar52._16_4_ = fVar141;
              fVar142 = auVar112._20_4_ * 0.0;
              auVar52._20_4_ = fVar142;
              fVar143 = auVar112._24_4_ * 0.0;
              auVar52._24_4_ = fVar143;
              auVar52._28_4_ = auVar112._28_4_;
              auVar180._8_4_ = 0x3f800000;
              auVar180._0_8_ = &DAT_3f8000003f800000;
              auVar180._12_4_ = 0x3f800000;
              auVar180._16_4_ = 0x3f800000;
              auVar180._20_4_ = 0x3f800000;
              auVar180._24_4_ = 0x3f800000;
              auVar180._28_4_ = 0x3f800000;
              auVar106 = vsubps_avx(auVar180,auVar51);
              local_5e0._0_4_ =
                   (uint)(bVar83 & 1) * (int)fVar161 | (uint)!(bool)(bVar83 & 1) * auVar106._0_4_;
              bVar89 = (bool)((byte)(uVar92 >> 1) & 1);
              local_5e0._4_4_ = (uint)bVar89 * (int)fVar166 | (uint)!bVar89 * auVar106._4_4_;
              bVar89 = (bool)((byte)(uVar92 >> 2) & 1);
              local_5e0._8_4_ = (uint)bVar89 * (int)fVar93 | (uint)!bVar89 * auVar106._8_4_;
              bVar89 = (bool)((byte)(uVar92 >> 3) & 1);
              local_5e0._12_4_ = (uint)bVar89 * (int)fVar160 | (uint)!bVar89 * auVar106._12_4_;
              bVar89 = (bool)((byte)(uVar92 >> 4) & 1);
              local_5e0._16_4_ = (uint)bVar89 * (int)fVar138 | (uint)!bVar89 * auVar106._16_4_;
              bVar89 = (bool)((byte)(uVar92 >> 5) & 1);
              local_5e0._20_4_ = (uint)bVar89 * (int)fVar139 | (uint)!bVar89 * auVar106._20_4_;
              bVar89 = (bool)((byte)(uVar92 >> 6) & 1);
              local_5e0._24_4_ = (uint)bVar89 * (int)fVar140 | (uint)!bVar89 * auVar106._24_4_;
              bVar89 = SUB81(uVar92 >> 7,0);
              local_5e0._28_4_ = (uint)bVar89 * auVar104._28_4_ | (uint)!bVar89 * auVar106._28_4_;
              auVar106 = vsubps_avx(auVar180,auVar52);
              bVar89 = (bool)((byte)(uVar92 >> 1) & 1);
              bVar17 = (bool)((byte)(uVar92 >> 2) & 1);
              bVar18 = (bool)((byte)(uVar92 >> 3) & 1);
              bVar19 = (bool)((byte)(uVar92 >> 4) & 1);
              bVar20 = (bool)((byte)(uVar92 >> 5) & 1);
              bVar21 = (bool)((byte)(uVar92 >> 6) & 1);
              bVar22 = SUB81(uVar92 >> 7,0);
              local_1a0._4_4_ = (uint)bVar89 * (int)fVar173 | (uint)!bVar89 * auVar106._4_4_;
              local_1a0._0_4_ =
                   (uint)(bVar83 & 1) * (int)fVar167 | (uint)!(bool)(bVar83 & 1) * auVar106._0_4_;
              local_1a0._8_4_ = (uint)bVar17 * (int)fVar174 | (uint)!bVar17 * auVar106._8_4_;
              local_1a0._12_4_ = (uint)bVar18 * (int)fVar175 | (uint)!bVar18 * auVar106._12_4_;
              local_1a0._16_4_ = (uint)bVar19 * (int)fVar141 | (uint)!bVar19 * auVar106._16_4_;
              local_1a0._20_4_ = (uint)bVar20 * (int)fVar142 | (uint)!bVar20 * auVar106._20_4_;
              local_1a0._24_4_ = (uint)bVar21 * (int)fVar143 | (uint)!bVar21 * auVar106._24_4_;
              local_1a0._28_4_ = (uint)bVar22 * auVar112._28_4_ | (uint)!bVar22 * auVar106._28_4_;
              local_600 = auVar105;
              goto LAB_01e74efe;
            }
          }
          local_230 = 0;
        }
LAB_01e74efe:
        auVar208 = ZEXT3264(local_500);
        auVar207 = ZEXT3264(local_4e0);
        auVar206 = ZEXT3264(local_4c0);
        auVar200 = ZEXT3264(auVar111);
        if (local_230 != 0) {
          auVar106 = vsubps_avx(ZEXT1632(auVar11),auVar102);
          auVar94 = vfmadd213ps_fma(auVar106,local_5e0,auVar102);
          uVar146 = *(undefined4 *)((long)local_6a8->ray_space + k * 4 + -0x10);
          auVar28._4_4_ = uVar146;
          auVar28._0_4_ = uVar146;
          auVar28._8_4_ = uVar146;
          auVar28._12_4_ = uVar146;
          auVar28._16_4_ = uVar146;
          auVar28._20_4_ = uVar146;
          auVar28._24_4_ = uVar146;
          auVar28._28_4_ = uVar146;
          auVar106 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar94._12_4_ + auVar94._12_4_,
                                                        CONCAT48(auVar94._8_4_ + auVar94._8_4_,
                                                                 CONCAT44(auVar94._4_4_ +
                                                                          auVar94._4_4_,
                                                                          auVar94._0_4_ +
                                                                          auVar94._0_4_)))),auVar28)
          ;
          uVar147 = vcmpps_avx512vl(local_600,auVar106,6);
          local_230 = local_230 & (byte)uVar147;
          if (local_230 != 0) {
            auVar153._8_4_ = 0xbf800000;
            auVar153._0_8_ = 0xbf800000bf800000;
            auVar153._12_4_ = 0xbf800000;
            auVar153._16_4_ = 0xbf800000;
            auVar153._20_4_ = 0xbf800000;
            auVar153._24_4_ = 0xbf800000;
            auVar153._28_4_ = 0xbf800000;
            auVar29._8_4_ = 0x40000000;
            auVar29._0_8_ = 0x4000000040000000;
            auVar29._12_4_ = 0x40000000;
            auVar29._16_4_ = 0x40000000;
            auVar29._20_4_ = 0x40000000;
            auVar29._24_4_ = 0x40000000;
            auVar29._28_4_ = 0x40000000;
            local_2c0 = vfmadd132ps_avx512vl(local_1a0,auVar153,auVar29);
            local_1a0 = local_2c0;
            auVar106 = local_1a0;
            local_280 = 0;
            local_270 = local_610._0_8_;
            uStack_268 = local_610._8_8_;
            local_260 = local_3f0._0_8_;
            uStack_258 = local_3f0._8_8_;
            local_250 = local_400._0_8_;
            uStack_248 = local_400._8_8_;
            local_240 = local_410._0_8_;
            uStack_238 = local_410._8_8_;
            if ((pGVar88->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                 (bVar89 = true, pGVar88->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                fVar145 = 1.0 / auVar187._0_4_;
                local_220[0] = fVar145 * (local_5e0._0_4_ + 0.0);
                local_220[1] = fVar145 * (local_5e0._4_4_ + 1.0);
                local_220[2] = fVar145 * (local_5e0._8_4_ + 2.0);
                local_220[3] = fVar145 * (local_5e0._12_4_ + 3.0);
                fStack_210 = fVar145 * (local_5e0._16_4_ + 4.0);
                fStack_20c = fVar145 * (local_5e0._20_4_ + 5.0);
                fStack_208 = fVar145 * (local_5e0._24_4_ + 6.0);
                fStack_204 = local_5e0._28_4_ + 7.0;
                local_1a0._0_8_ = local_2c0._0_8_;
                local_1a0._8_8_ = local_2c0._8_8_;
                local_1a0._16_8_ = local_2c0._16_8_;
                local_1a0._24_8_ = local_2c0._24_8_;
                local_200 = local_1a0._0_8_;
                uStack_1f8 = local_1a0._8_8_;
                uStack_1f0 = local_1a0._16_8_;
                uStack_1e8 = local_1a0._24_8_;
                local_1e0 = local_600;
                local_3c0 = 0;
                uVar87 = (ulong)local_230;
                for (uVar92 = uVar87; (uVar92 & 1) == 0; uVar92 = uVar92 >> 1 | 0x8000000000000000)
                {
                  local_3c0 = local_3c0 + 1;
                }
                local_640 = vpbroadcastd_avx512vl();
                local_650 = local_3f0._0_4_;
                uStack_64c = local_3f0._4_4_;
                uStack_648 = local_3f0._8_8_;
                local_660 = vpbroadcastd_avx512vl();
                local_580 = local_400._0_8_;
                uStack_578 = local_400._8_8_;
                local_590 = local_410._0_4_;
                fStack_58c = local_410._4_4_;
                fStack_588 = local_410._8_4_;
                fStack_584 = local_410._12_4_;
                bVar89 = true;
                local_520 = fVar168;
                local_4a0 = auVar111;
                local_2e0 = local_5e0;
                local_2a0 = local_600;
                local_27c = iVar13;
                local_1a0 = auVar106;
                do {
                  auVar96 = auVar205._0_16_;
                  uVar146 = *(undefined4 *)(ray + k * 4 + 0x80);
                  local_340 = local_220[local_3c0];
                  local_330 = *(undefined4 *)((long)&local_200 + local_3c0 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1e0 + local_3c0 * 4);
                  local_6a0.context = context->user;
                  fVar167 = 1.0 - local_340;
                  fVar145 = fVar167 * fVar167 * -3.0;
                  auVar94 = vfmadd231ss_fma(ZEXT416((uint)(fVar167 * fVar167)),
                                            ZEXT416((uint)(local_340 * fVar167)),ZEXT416(0xc0000000)
                                           );
                  auVar95 = vfmsub132ss_fma(ZEXT416((uint)(local_340 * fVar167)),
                                            ZEXT416((uint)(local_340 * local_340)),
                                            ZEXT416(0x40000000));
                  fVar167 = auVar94._0_4_ * 3.0;
                  fVar173 = auVar95._0_4_ * 3.0;
                  fVar174 = local_340 * local_340 * 3.0;
                  auVar176._0_4_ = fVar174 * local_590;
                  auVar176._4_4_ = fVar174 * fStack_58c;
                  auVar176._8_4_ = fVar174 * fStack_588;
                  auVar176._12_4_ = fVar174 * fStack_584;
                  auVar148._4_4_ = fVar173;
                  auVar148._0_4_ = fVar173;
                  auVar148._8_4_ = fVar173;
                  auVar148._12_4_ = fVar173;
                  auVar78._8_8_ = uStack_578;
                  auVar78._0_8_ = local_580;
                  auVar94 = vfmadd132ps_fma(auVar148,auVar176,auVar78);
                  auVar162._4_4_ = fVar167;
                  auVar162._0_4_ = fVar167;
                  auVar162._8_4_ = fVar167;
                  auVar162._12_4_ = fVar167;
                  auVar76._4_4_ = uStack_64c;
                  auVar76._0_4_ = local_650;
                  auVar76._8_8_ = uStack_648;
                  auVar94 = vfmadd132ps_fma(auVar162,auVar94,auVar76);
                  auVar149._4_4_ = fVar145;
                  auVar149._0_4_ = fVar145;
                  auVar149._8_4_ = fVar145;
                  auVar149._12_4_ = fVar145;
                  auVar94 = vfmadd132ps_fma(auVar149,auVar94,local_610);
                  local_370 = auVar94._0_4_;
                  local_360 = vshufps_avx(auVar94,auVar94,0x55);
                  local_350 = vshufps_avx(auVar94,auVar94,0xaa);
                  local_320 = local_660._0_8_;
                  uStack_318 = local_660._8_8_;
                  local_310 = local_640;
                  vpcmpeqd_avx2(ZEXT1632(local_640),ZEXT1632(local_640));
                  uStack_2fc = (local_6a0.context)->instID[0];
                  local_300 = uStack_2fc;
                  uStack_2f8 = uStack_2fc;
                  uStack_2f4 = uStack_2fc;
                  uStack_2f0 = (local_6a0.context)->instPrimID[0];
                  uStack_2ec = uStack_2f0;
                  uStack_2e8 = uStack_2f0;
                  uStack_2e4 = uStack_2f0;
                  local_6d0 = local_420._0_8_;
                  uStack_6c8 = local_420._8_8_;
                  local_6a0.valid = (int *)&local_6d0;
                  local_6a0.geometryUserPtr = pGVar88->userPtr;
                  local_6a0.hit = (RTCHitN *)&local_370;
                  local_6a0.N = 4;
                  local_3a0 = (undefined4)uVar87;
                  uStack_39c = (undefined4)(uVar87 >> 0x20);
                  local_6a0.ray = (RTCRayN *)ray;
                  uStack_36c = local_370;
                  uStack_368 = local_370;
                  uStack_364 = local_370;
                  fStack_33c = local_340;
                  fStack_338 = local_340;
                  fStack_334 = local_340;
                  uStack_32c = local_330;
                  uStack_328 = local_330;
                  uStack_324 = local_330;
                  if (pGVar88->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar88->occlusionFilterN)(&local_6a0);
                    uVar87 = CONCAT44(uStack_39c,local_3a0);
                    auVar195 = ZEXT1664(_local_670);
                    auVar200 = ZEXT3264(local_4a0);
                    auVar208 = ZEXT3264(local_500);
                    auVar207 = ZEXT3264(local_4e0);
                    auVar206 = ZEXT3264(local_4c0);
                    auVar209 = ZEXT3264(local_5c0);
                    auVar201 = ZEXT3264(local_480);
                    auVar204 = ZEXT3264(local_460);
                    auVar203 = ZEXT3264(local_3e0);
                    auVar202 = ZEXT3264(local_440);
                    auVar94 = vxorps_avx512vl(auVar96,auVar96);
                    auVar205 = ZEXT1664(auVar94);
                    fVar168 = local_520;
                  }
                  auVar94 = auVar205._0_16_;
                  auVar72._8_8_ = uStack_6c8;
                  auVar72._0_8_ = local_6d0;
                  uVar92 = vptestmd_avx512vl(auVar72,auVar72);
                  if ((uVar92 & 0xf) != 0) {
                    p_Var16 = context->args->filter;
                    if ((p_Var16 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar88->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var16)(&local_6a0);
                      uVar87 = CONCAT44(uStack_39c,local_3a0);
                      auVar195 = ZEXT1664(_local_670);
                      auVar200 = ZEXT3264(local_4a0);
                      auVar208 = ZEXT3264(local_500);
                      auVar207 = ZEXT3264(local_4e0);
                      auVar206 = ZEXT3264(local_4c0);
                      auVar209 = ZEXT3264(local_5c0);
                      auVar201 = ZEXT3264(local_480);
                      auVar204 = ZEXT3264(local_460);
                      auVar203 = ZEXT3264(local_3e0);
                      auVar202 = ZEXT3264(local_440);
                      auVar94 = vxorps_avx512vl(auVar94,auVar94);
                      auVar205 = ZEXT1664(auVar94);
                      fVar168 = local_520;
                    }
                    auVar111 = auVar200._0_32_;
                    auVar73._8_8_ = uStack_6c8;
                    auVar73._0_8_ = local_6d0;
                    auVar94 = *(undefined1 (*) [16])(local_6a0.ray + 0x80);
                    uVar92 = vptestmd_avx512vl(auVar73,auVar73);
                    uVar92 = uVar92 & 0xf;
                    auVar95 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                    bVar17 = (bool)((byte)uVar92 & 1);
                    auVar100._0_4_ = (uint)bVar17 * auVar95._0_4_ | (uint)!bVar17 * auVar94._0_4_;
                    bVar17 = (bool)((byte)(uVar92 >> 1) & 1);
                    auVar100._4_4_ = (uint)bVar17 * auVar95._4_4_ | (uint)!bVar17 * auVar94._4_4_;
                    bVar17 = (bool)((byte)(uVar92 >> 2) & 1);
                    auVar100._8_4_ = (uint)bVar17 * auVar95._8_4_ | (uint)!bVar17 * auVar94._8_4_;
                    bVar17 = SUB81(uVar92 >> 3,0);
                    auVar100._12_4_ = (uint)bVar17 * auVar95._12_4_ | (uint)!bVar17 * auVar94._12_4_
                    ;
                    *(undefined1 (*) [16])(local_6a0.ray + 0x80) = auVar100;
                    fVar145 = auVar195._0_4_;
                    if ((byte)uVar92 != 0) break;
                  }
                  auVar111 = auVar200._0_32_;
                  *(undefined4 *)(ray + k * 4 + 0x80) = uVar146;
                  uVar92 = local_3c0 & 0x3f;
                  local_3c0 = 0;
                  uVar87 = uVar87 ^ 1L << uVar92;
                  for (uVar92 = uVar87; (uVar92 & 1) == 0; uVar92 = uVar92 >> 1 | 0x8000000000000000
                      ) {
                    local_3c0 = local_3c0 + 1;
                  }
                  bVar89 = uVar87 != 0;
                  fVar145 = auVar195._0_4_;
                } while (bVar89);
              }
              goto LAB_01e754e2;
            }
          }
        }
        bVar89 = false;
      }
LAB_01e754e2:
      local_520 = fVar145;
      if (8 < iVar13) {
        auVar106 = vpbroadcastd_avx512vl();
        auVar195 = ZEXT3264(auVar106);
        fStack_3b8 = 1.0 / (float)local_630._0_4_;
        local_630 = vpbroadcastd_avx512vl();
        local_620 = vpbroadcastd_avx512vl();
        lVar91 = 8;
        fStack_51c = local_520;
        fStack_518 = local_520;
        fStack_514 = local_520;
        fStack_510 = local_520;
        fStack_50c = local_520;
        fStack_508 = local_520;
        fStack_504 = local_520;
        local_4a0 = auVar111;
        fStack_3b4 = fStack_3b8;
        fStack_3b0 = fStack_3b8;
        fStack_3ac = fStack_3b8;
        fStack_3a8 = fStack_3b8;
        fStack_3a4 = fStack_3b8;
        local_3a0 = fVar168;
        uStack_39c = fVar168;
        uStack_398 = fVar168;
        uStack_394 = fVar168;
        uStack_390 = fVar168;
        uStack_38c = fVar168;
        uStack_388 = fVar168;
        uStack_384 = fVar168;
        local_3c0._0_4_ = fStack_3b8;
        local_3c0._4_4_ = fStack_3b8;
        do {
          auVar106 = vpbroadcastd_avx512vl();
          auVar107 = vpor_avx2(auVar106,_DAT_0205a920);
          uVar24 = vpcmpgtd_avx512vl(auVar195._0_32_,auVar107);
          auVar106 = *(undefined1 (*) [32])(bezier_basis0 + lVar91 * 4 + lVar25);
          auVar105 = *(undefined1 (*) [32])(lVar25 + 0x2227768 + lVar91 * 4);
          auVar117 = *(undefined1 (*) [32])(lVar25 + 0x2227bec + lVar91 * 4);
          auVar116 = *(undefined1 (*) [32])(lVar25 + 0x2228070 + lVar91 * 4);
          local_4e0 = auVar207._0_32_;
          auVar108 = vmulps_avx512vl(local_4e0,auVar116);
          local_500 = auVar208._0_32_;
          auVar115 = vmulps_avx512vl(local_500,auVar116);
          auVar53._4_4_ = auVar116._4_4_ * (float)local_100._4_4_;
          auVar53._0_4_ = auVar116._0_4_ * (float)local_100._0_4_;
          auVar53._8_4_ = auVar116._8_4_ * fStack_f8;
          auVar53._12_4_ = auVar116._12_4_ * fStack_f4;
          auVar53._16_4_ = auVar116._16_4_ * fStack_f0;
          auVar53._20_4_ = auVar116._20_4_ * fStack_ec;
          auVar53._24_4_ = auVar116._24_4_ * fStack_e8;
          auVar53._28_4_ = auVar107._28_4_;
          auVar179 = auVar209._0_32_;
          auVar107 = vfmadd231ps_avx512vl(auVar108,auVar117,auVar179);
          local_4c0 = auVar206._0_32_;
          auVar108 = vfmadd231ps_avx512vl(auVar115,auVar117,local_4c0);
          auVar115 = vfmadd231ps_avx512vl(auVar53,auVar117,local_e0);
          auVar178 = auVar204._0_32_;
          auVar107 = vfmadd231ps_avx512vl(auVar107,auVar105,auVar178);
          auVar156 = auVar201._0_32_;
          auVar108 = vfmadd231ps_avx512vl(auVar108,auVar105,auVar156);
          auVar94 = vfmadd231ps_fma(auVar115,auVar105,local_c0);
          auVar159 = auVar202._0_32_;
          auVar104 = vfmadd231ps_avx512vl(auVar107,auVar106,auVar159);
          local_3e0 = auVar203._0_32_;
          auVar112 = vfmadd231ps_avx512vl(auVar108,auVar106,local_3e0);
          auVar107 = *(undefined1 (*) [32])(bezier_basis1 + lVar91 * 4 + lVar25);
          auVar108 = *(undefined1 (*) [32])(lVar25 + 0x2229b88 + lVar91 * 4);
          auVar94 = vfmadd231ps_fma(ZEXT1632(auVar94),auVar106,local_a0);
          auVar115 = *(undefined1 (*) [32])(lVar25 + 0x222a00c + lVar91 * 4);
          auVar109 = *(undefined1 (*) [32])(lVar25 + 0x222a490 + lVar91 * 4);
          auVar111 = vmulps_avx512vl(local_4e0,auVar109);
          auVar110 = vmulps_avx512vl(local_500,auVar109);
          auVar54._4_4_ = auVar109._4_4_ * (float)local_100._4_4_;
          auVar54._0_4_ = auVar109._0_4_ * (float)local_100._0_4_;
          auVar54._8_4_ = auVar109._8_4_ * fStack_f8;
          auVar54._12_4_ = auVar109._12_4_ * fStack_f4;
          auVar54._16_4_ = auVar109._16_4_ * fStack_f0;
          auVar54._20_4_ = auVar109._20_4_ * fStack_ec;
          auVar54._24_4_ = auVar109._24_4_ * fStack_e8;
          auVar54._28_4_ = uStack_e4;
          auVar111 = vfmadd231ps_avx512vl(auVar111,auVar115,auVar179);
          auVar110 = vfmadd231ps_avx512vl(auVar110,auVar115,local_4c0);
          auVar113 = vfmadd231ps_avx512vl(auVar54,auVar115,local_e0);
          auVar111 = vfmadd231ps_avx512vl(auVar111,auVar108,auVar178);
          auVar110 = vfmadd231ps_avx512vl(auVar110,auVar108,auVar156);
          auVar95 = vfmadd231ps_fma(auVar113,auVar108,local_c0);
          auVar113 = vfmadd231ps_avx512vl(auVar111,auVar107,auVar159);
          auVar102 = vfmadd231ps_avx512vl(auVar110,auVar107,local_3e0);
          auVar95 = vfmadd231ps_fma(ZEXT1632(auVar95),auVar107,local_a0);
          auVar103 = vmaxps_avx512vl(ZEXT1632(auVar94),ZEXT1632(auVar95));
          auVar111 = vsubps_avx(auVar113,auVar104);
          auVar110 = vsubps_avx(auVar102,auVar112);
          auVar114 = vmulps_avx512vl(auVar112,auVar111);
          auVar128 = vmulps_avx512vl(auVar104,auVar110);
          auVar114 = vsubps_avx512vl(auVar114,auVar128);
          auVar128 = vmulps_avx512vl(auVar110,auVar110);
          auVar128 = vfmadd231ps_avx512vl(auVar128,auVar111,auVar111);
          auVar103 = vmulps_avx512vl(auVar103,auVar103);
          auVar103 = vmulps_avx512vl(auVar103,auVar128);
          auVar114 = vmulps_avx512vl(auVar114,auVar114);
          uVar147 = vcmpps_avx512vl(auVar114,auVar103,2);
          local_230 = (byte)uVar24 & (byte)uVar147;
          if (local_230 == 0) {
            auVar200 = ZEXT3264(auVar156);
            auVar209 = ZEXT3264(auVar179);
          }
          else {
            auVar109 = vmulps_avx512vl(local_4a0,auVar109);
            auVar115 = vfmadd213ps_avx512vl(auVar115,local_160,auVar109);
            auVar108 = vfmadd213ps_avx512vl(auVar108,local_140,auVar115);
            auVar107 = vfmadd213ps_avx512vl(auVar107,local_120,auVar108);
            auVar116 = vmulps_avx512vl(local_4a0,auVar116);
            auVar117 = vfmadd213ps_avx512vl(auVar117,local_160,auVar116);
            auVar105 = vfmadd213ps_avx512vl(auVar105,local_140,auVar117);
            auVar108 = vfmadd213ps_avx512vl(auVar106,local_120,auVar105);
            auVar106 = *(undefined1 (*) [32])(lVar25 + 0x22284f4 + lVar91 * 4);
            auVar105 = *(undefined1 (*) [32])(lVar25 + 0x2228978 + lVar91 * 4);
            auVar117 = *(undefined1 (*) [32])(lVar25 + 0x2228dfc + lVar91 * 4);
            auVar116 = *(undefined1 (*) [32])(lVar25 + 0x2229280 + lVar91 * 4);
            auVar115 = vmulps_avx512vl(local_4e0,auVar116);
            auVar109 = vmulps_avx512vl(local_500,auVar116);
            auVar116 = vmulps_avx512vl(local_4a0,auVar116);
            auVar115 = vfmadd231ps_avx512vl(auVar115,auVar117,auVar179);
            auVar109 = vfmadd231ps_avx512vl(auVar109,auVar117,local_4c0);
            auVar117 = vfmadd231ps_avx512vl(auVar116,local_160,auVar117);
            auVar116 = vfmadd231ps_avx512vl(auVar115,auVar105,auVar178);
            auVar115 = vfmadd231ps_avx512vl(auVar109,auVar105,auVar156);
            auVar105 = vfmadd231ps_avx512vl(auVar117,local_140,auVar105);
            auVar116 = vfmadd231ps_avx512vl(auVar116,auVar106,auVar159);
            auVar115 = vfmadd231ps_avx512vl(auVar115,auVar106,local_3e0);
            auVar109 = vfmadd231ps_avx512vl(auVar105,local_120,auVar106);
            auVar106 = *(undefined1 (*) [32])(lVar25 + 0x222a914 + lVar91 * 4);
            auVar105 = *(undefined1 (*) [32])(lVar25 + 0x222b21c + lVar91 * 4);
            auVar117 = *(undefined1 (*) [32])(lVar25 + 0x222b6a0 + lVar91 * 4);
            auVar103 = vmulps_avx512vl(local_4e0,auVar117);
            auVar114 = vmulps_avx512vl(local_500,auVar117);
            auVar117 = vmulps_avx512vl(local_4a0,auVar117);
            auVar103 = vfmadd231ps_avx512vl(auVar103,auVar105,auVar179);
            auVar114 = vfmadd231ps_avx512vl(auVar114,auVar105,local_4c0);
            auVar117 = vfmadd231ps_avx512vl(auVar117,local_160,auVar105);
            auVar105 = *(undefined1 (*) [32])(lVar25 + 0x222ad98 + lVar91 * 4);
            auVar103 = vfmadd231ps_avx512vl(auVar103,auVar105,auVar178);
            auVar114 = vfmadd231ps_avx512vl(auVar114,auVar105,auVar156);
            auVar105 = vfmadd231ps_avx512vl(auVar117,local_140,auVar105);
            auVar117 = vfmadd231ps_avx512vl(auVar103,auVar106,auVar159);
            auVar103 = vfmadd231ps_avx512vl(auVar114,auVar106,local_3e0);
            auVar105 = vfmadd231ps_avx512vl(auVar105,local_120,auVar106);
            auVar114 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar116,auVar114);
            vandps_avx512vl(auVar115,auVar114);
            auVar106 = vmaxps_avx(auVar114,auVar114);
            vandps_avx512vl(auVar109,auVar114);
            auVar106 = vmaxps_avx(auVar106,auVar114);
            auVar80._4_4_ = fStack_51c;
            auVar80._0_4_ = local_520;
            auVar80._8_4_ = fStack_518;
            auVar80._12_4_ = fStack_514;
            auVar80._16_4_ = fStack_510;
            auVar80._20_4_ = fStack_50c;
            auVar80._24_4_ = fStack_508;
            auVar80._28_4_ = fStack_504;
            uVar92 = vcmpps_avx512vl(auVar106,auVar80,1);
            bVar17 = (bool)((byte)uVar92 & 1);
            auVar129._0_4_ = (float)((uint)bVar17 * auVar111._0_4_ | (uint)!bVar17 * auVar116._0_4_)
            ;
            bVar17 = (bool)((byte)(uVar92 >> 1) & 1);
            auVar129._4_4_ = (float)((uint)bVar17 * auVar111._4_4_ | (uint)!bVar17 * auVar116._4_4_)
            ;
            bVar17 = (bool)((byte)(uVar92 >> 2) & 1);
            auVar129._8_4_ = (float)((uint)bVar17 * auVar111._8_4_ | (uint)!bVar17 * auVar116._8_4_)
            ;
            bVar17 = (bool)((byte)(uVar92 >> 3) & 1);
            auVar129._12_4_ =
                 (float)((uint)bVar17 * auVar111._12_4_ | (uint)!bVar17 * auVar116._12_4_);
            bVar17 = (bool)((byte)(uVar92 >> 4) & 1);
            auVar129._16_4_ =
                 (float)((uint)bVar17 * auVar111._16_4_ | (uint)!bVar17 * auVar116._16_4_);
            bVar17 = (bool)((byte)(uVar92 >> 5) & 1);
            auVar129._20_4_ =
                 (float)((uint)bVar17 * auVar111._20_4_ | (uint)!bVar17 * auVar116._20_4_);
            bVar17 = (bool)((byte)(uVar92 >> 6) & 1);
            auVar129._24_4_ =
                 (float)((uint)bVar17 * auVar111._24_4_ | (uint)!bVar17 * auVar116._24_4_);
            bVar17 = SUB81(uVar92 >> 7,0);
            auVar129._28_4_ = (uint)bVar17 * auVar111._28_4_ | (uint)!bVar17 * auVar116._28_4_;
            bVar17 = (bool)((byte)uVar92 & 1);
            auVar130._0_4_ = (float)((uint)bVar17 * auVar110._0_4_ | (uint)!bVar17 * auVar115._0_4_)
            ;
            bVar17 = (bool)((byte)(uVar92 >> 1) & 1);
            auVar130._4_4_ = (float)((uint)bVar17 * auVar110._4_4_ | (uint)!bVar17 * auVar115._4_4_)
            ;
            bVar17 = (bool)((byte)(uVar92 >> 2) & 1);
            auVar130._8_4_ = (float)((uint)bVar17 * auVar110._8_4_ | (uint)!bVar17 * auVar115._8_4_)
            ;
            bVar17 = (bool)((byte)(uVar92 >> 3) & 1);
            auVar130._12_4_ =
                 (float)((uint)bVar17 * auVar110._12_4_ | (uint)!bVar17 * auVar115._12_4_);
            bVar17 = (bool)((byte)(uVar92 >> 4) & 1);
            auVar130._16_4_ =
                 (float)((uint)bVar17 * auVar110._16_4_ | (uint)!bVar17 * auVar115._16_4_);
            bVar17 = (bool)((byte)(uVar92 >> 5) & 1);
            auVar130._20_4_ =
                 (float)((uint)bVar17 * auVar110._20_4_ | (uint)!bVar17 * auVar115._20_4_);
            bVar17 = (bool)((byte)(uVar92 >> 6) & 1);
            auVar130._24_4_ =
                 (float)((uint)bVar17 * auVar110._24_4_ | (uint)!bVar17 * auVar115._24_4_);
            bVar17 = SUB81(uVar92 >> 7,0);
            auVar130._28_4_ = (uint)bVar17 * auVar110._28_4_ | (uint)!bVar17 * auVar115._28_4_;
            vandps_avx512vl(auVar117,auVar114);
            vandps_avx512vl(auVar103,auVar114);
            auVar106 = vmaxps_avx(auVar130,auVar130);
            vandps_avx512vl(auVar105,auVar114);
            auVar106 = vmaxps_avx(auVar106,auVar130);
            uVar92 = vcmpps_avx512vl(auVar106,auVar80,1);
            bVar17 = (bool)((byte)uVar92 & 1);
            auVar131._0_4_ = (uint)bVar17 * auVar111._0_4_ | (uint)!bVar17 * auVar117._0_4_;
            bVar17 = (bool)((byte)(uVar92 >> 1) & 1);
            auVar131._4_4_ = (uint)bVar17 * auVar111._4_4_ | (uint)!bVar17 * auVar117._4_4_;
            bVar17 = (bool)((byte)(uVar92 >> 2) & 1);
            auVar131._8_4_ = (uint)bVar17 * auVar111._8_4_ | (uint)!bVar17 * auVar117._8_4_;
            bVar17 = (bool)((byte)(uVar92 >> 3) & 1);
            auVar131._12_4_ = (uint)bVar17 * auVar111._12_4_ | (uint)!bVar17 * auVar117._12_4_;
            bVar17 = (bool)((byte)(uVar92 >> 4) & 1);
            auVar131._16_4_ = (uint)bVar17 * auVar111._16_4_ | (uint)!bVar17 * auVar117._16_4_;
            bVar17 = (bool)((byte)(uVar92 >> 5) & 1);
            auVar131._20_4_ = (uint)bVar17 * auVar111._20_4_ | (uint)!bVar17 * auVar117._20_4_;
            bVar17 = (bool)((byte)(uVar92 >> 6) & 1);
            auVar131._24_4_ = (uint)bVar17 * auVar111._24_4_ | (uint)!bVar17 * auVar117._24_4_;
            bVar17 = SUB81(uVar92 >> 7,0);
            auVar131._28_4_ = (uint)bVar17 * auVar111._28_4_ | (uint)!bVar17 * auVar117._28_4_;
            bVar17 = (bool)((byte)uVar92 & 1);
            auVar132._0_4_ = (float)((uint)bVar17 * auVar110._0_4_ | (uint)!bVar17 * auVar103._0_4_)
            ;
            bVar17 = (bool)((byte)(uVar92 >> 1) & 1);
            auVar132._4_4_ = (float)((uint)bVar17 * auVar110._4_4_ | (uint)!bVar17 * auVar103._4_4_)
            ;
            bVar17 = (bool)((byte)(uVar92 >> 2) & 1);
            auVar132._8_4_ = (float)((uint)bVar17 * auVar110._8_4_ | (uint)!bVar17 * auVar103._8_4_)
            ;
            bVar17 = (bool)((byte)(uVar92 >> 3) & 1);
            auVar132._12_4_ =
                 (float)((uint)bVar17 * auVar110._12_4_ | (uint)!bVar17 * auVar103._12_4_);
            bVar17 = (bool)((byte)(uVar92 >> 4) & 1);
            auVar132._16_4_ =
                 (float)((uint)bVar17 * auVar110._16_4_ | (uint)!bVar17 * auVar103._16_4_);
            bVar17 = (bool)((byte)(uVar92 >> 5) & 1);
            auVar132._20_4_ =
                 (float)((uint)bVar17 * auVar110._20_4_ | (uint)!bVar17 * auVar103._20_4_);
            bVar17 = (bool)((byte)(uVar92 >> 6) & 1);
            auVar132._24_4_ =
                 (float)((uint)bVar17 * auVar110._24_4_ | (uint)!bVar17 * auVar103._24_4_);
            bVar17 = SUB81(uVar92 >> 7,0);
            auVar132._28_4_ = (uint)bVar17 * auVar110._28_4_ | (uint)!bVar17 * auVar103._28_4_;
            auVar189._8_4_ = 0x80000000;
            auVar189._0_8_ = 0x8000000080000000;
            auVar189._12_4_ = 0x80000000;
            auVar189._16_4_ = 0x80000000;
            auVar189._20_4_ = 0x80000000;
            auVar189._24_4_ = 0x80000000;
            auVar189._28_4_ = 0x80000000;
            auVar106 = vxorps_avx512vl(auVar131,auVar189);
            auVar103 = auVar205._0_32_;
            auVar105 = vfmadd213ps_avx512vl(auVar129,auVar129,auVar103);
            auVar96 = vfmadd231ps_fma(auVar105,auVar130,auVar130);
            auVar105 = vrsqrt14ps_avx512vl(ZEXT1632(auVar96));
            auVar199._8_4_ = 0xbf000000;
            auVar199._0_8_ = 0xbf000000bf000000;
            auVar199._12_4_ = 0xbf000000;
            auVar199._16_4_ = 0xbf000000;
            auVar199._20_4_ = 0xbf000000;
            auVar199._24_4_ = 0xbf000000;
            auVar199._28_4_ = 0xbf000000;
            fVar168 = auVar105._0_4_;
            fVar145 = auVar105._4_4_;
            fVar167 = auVar105._8_4_;
            fVar173 = auVar105._12_4_;
            fVar174 = auVar105._16_4_;
            fVar175 = auVar105._20_4_;
            fVar161 = auVar105._24_4_;
            auVar55._4_4_ = fVar145 * fVar145 * fVar145 * auVar96._4_4_ * -0.5;
            auVar55._0_4_ = fVar168 * fVar168 * fVar168 * auVar96._0_4_ * -0.5;
            auVar55._8_4_ = fVar167 * fVar167 * fVar167 * auVar96._8_4_ * -0.5;
            auVar55._12_4_ = fVar173 * fVar173 * fVar173 * auVar96._12_4_ * -0.5;
            auVar55._16_4_ = fVar174 * fVar174 * fVar174 * -0.0;
            auVar55._20_4_ = fVar175 * fVar175 * fVar175 * -0.0;
            auVar55._24_4_ = fVar161 * fVar161 * fVar161 * -0.0;
            auVar55._28_4_ = auVar130._28_4_;
            auVar117 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
            auVar105 = vfmadd231ps_avx512vl(auVar55,auVar117,auVar105);
            auVar56._4_4_ = auVar130._4_4_ * auVar105._4_4_;
            auVar56._0_4_ = auVar130._0_4_ * auVar105._0_4_;
            auVar56._8_4_ = auVar130._8_4_ * auVar105._8_4_;
            auVar56._12_4_ = auVar130._12_4_ * auVar105._12_4_;
            auVar56._16_4_ = auVar130._16_4_ * auVar105._16_4_;
            auVar56._20_4_ = auVar130._20_4_ * auVar105._20_4_;
            auVar56._24_4_ = auVar130._24_4_ * auVar105._24_4_;
            auVar56._28_4_ = 0;
            auVar57._4_4_ = auVar105._4_4_ * -auVar129._4_4_;
            auVar57._0_4_ = auVar105._0_4_ * -auVar129._0_4_;
            auVar57._8_4_ = auVar105._8_4_ * -auVar129._8_4_;
            auVar57._12_4_ = auVar105._12_4_ * -auVar129._12_4_;
            auVar57._16_4_ = auVar105._16_4_ * -auVar129._16_4_;
            auVar57._20_4_ = auVar105._20_4_ * -auVar129._20_4_;
            auVar57._24_4_ = auVar105._24_4_ * -auVar129._24_4_;
            auVar57._28_4_ = auVar130._28_4_;
            auVar116 = vmulps_avx512vl(auVar105,auVar103);
            auVar105 = vfmadd213ps_avx512vl(auVar131,auVar131,auVar103);
            auVar105 = vfmadd231ps_avx512vl(auVar105,auVar132,auVar132);
            auVar115 = vrsqrt14ps_avx512vl(auVar105);
            auVar105 = vmulps_avx512vl(auVar105,auVar199);
            fVar168 = auVar115._0_4_;
            fVar145 = auVar115._4_4_;
            fVar167 = auVar115._8_4_;
            fVar173 = auVar115._12_4_;
            fVar174 = auVar115._16_4_;
            fVar175 = auVar115._20_4_;
            fVar161 = auVar115._24_4_;
            auVar58._4_4_ = fVar145 * fVar145 * fVar145 * auVar105._4_4_;
            auVar58._0_4_ = fVar168 * fVar168 * fVar168 * auVar105._0_4_;
            auVar58._8_4_ = fVar167 * fVar167 * fVar167 * auVar105._8_4_;
            auVar58._12_4_ = fVar173 * fVar173 * fVar173 * auVar105._12_4_;
            auVar58._16_4_ = fVar174 * fVar174 * fVar174 * auVar105._16_4_;
            auVar58._20_4_ = fVar175 * fVar175 * fVar175 * auVar105._20_4_;
            auVar58._24_4_ = fVar161 * fVar161 * fVar161 * auVar105._24_4_;
            auVar58._28_4_ = auVar105._28_4_;
            auVar105 = vfmadd231ps_avx512vl(auVar58,auVar117,auVar115);
            auVar59._4_4_ = auVar132._4_4_ * auVar105._4_4_;
            auVar59._0_4_ = auVar132._0_4_ * auVar105._0_4_;
            auVar59._8_4_ = auVar132._8_4_ * auVar105._8_4_;
            auVar59._12_4_ = auVar132._12_4_ * auVar105._12_4_;
            auVar59._16_4_ = auVar132._16_4_ * auVar105._16_4_;
            auVar59._20_4_ = auVar132._20_4_ * auVar105._20_4_;
            auVar59._24_4_ = auVar132._24_4_ * auVar105._24_4_;
            auVar59._28_4_ = auVar115._28_4_;
            auVar60._4_4_ = auVar105._4_4_ * auVar106._4_4_;
            auVar60._0_4_ = auVar105._0_4_ * auVar106._0_4_;
            auVar60._8_4_ = auVar105._8_4_ * auVar106._8_4_;
            auVar60._12_4_ = auVar105._12_4_ * auVar106._12_4_;
            auVar60._16_4_ = auVar105._16_4_ * auVar106._16_4_;
            auVar60._20_4_ = auVar105._20_4_ * auVar106._20_4_;
            auVar60._24_4_ = auVar105._24_4_ * auVar106._24_4_;
            auVar60._28_4_ = auVar106._28_4_;
            auVar106 = vmulps_avx512vl(auVar105,auVar103);
            auVar96 = vfmadd213ps_fma(auVar56,ZEXT1632(auVar94),auVar104);
            auVar105 = ZEXT1632(auVar94);
            auVar6 = vfmadd213ps_fma(auVar57,auVar105,auVar112);
            auVar117 = vfmadd213ps_avx512vl(auVar116,auVar105,auVar108);
            auVar115 = vfmadd213ps_avx512vl(auVar59,ZEXT1632(auVar95),auVar113);
            auVar11 = vfnmadd213ps_fma(auVar56,auVar105,auVar104);
            auVar109 = ZEXT1632(auVar95);
            auVar7 = vfmadd213ps_fma(auVar60,auVar109,auVar102);
            auVar97 = vfnmadd213ps_fma(auVar57,auVar105,auVar112);
            auVar8 = vfmadd213ps_fma(auVar106,auVar109,auVar107);
            auVar112 = ZEXT1632(auVar94);
            auVar99 = vfnmadd231ps_fma(auVar108,auVar112,auVar116);
            auVar98 = vfnmadd213ps_fma(auVar59,auVar109,auVar113);
            auVar155 = vfnmadd213ps_fma(auVar60,auVar109,auVar102);
            auVar157 = vfnmadd231ps_fma(auVar107,ZEXT1632(auVar95),auVar106);
            auVar107 = vsubps_avx512vl(auVar115,ZEXT1632(auVar11));
            auVar106 = vsubps_avx(ZEXT1632(auVar7),ZEXT1632(auVar97));
            auVar105 = vsubps_avx(ZEXT1632(auVar8),ZEXT1632(auVar99));
            auVar61._4_4_ = auVar106._4_4_ * auVar99._4_4_;
            auVar61._0_4_ = auVar106._0_4_ * auVar99._0_4_;
            auVar61._8_4_ = auVar106._8_4_ * auVar99._8_4_;
            auVar61._12_4_ = auVar106._12_4_ * auVar99._12_4_;
            auVar61._16_4_ = auVar106._16_4_ * 0.0;
            auVar61._20_4_ = auVar106._20_4_ * 0.0;
            auVar61._24_4_ = auVar106._24_4_ * 0.0;
            auVar61._28_4_ = auVar116._28_4_;
            auVar94 = vfmsub231ps_fma(auVar61,ZEXT1632(auVar97),auVar105);
            auVar62._4_4_ = auVar105._4_4_ * auVar11._4_4_;
            auVar62._0_4_ = auVar105._0_4_ * auVar11._0_4_;
            auVar62._8_4_ = auVar105._8_4_ * auVar11._8_4_;
            auVar62._12_4_ = auVar105._12_4_ * auVar11._12_4_;
            auVar62._16_4_ = auVar105._16_4_ * 0.0;
            auVar62._20_4_ = auVar105._20_4_ * 0.0;
            auVar62._24_4_ = auVar105._24_4_ * 0.0;
            auVar62._28_4_ = auVar105._28_4_;
            auVar9 = vfmsub231ps_fma(auVar62,ZEXT1632(auVar99),auVar107);
            auVar63._4_4_ = auVar97._4_4_ * auVar107._4_4_;
            auVar63._0_4_ = auVar97._0_4_ * auVar107._0_4_;
            auVar63._8_4_ = auVar97._8_4_ * auVar107._8_4_;
            auVar63._12_4_ = auVar97._12_4_ * auVar107._12_4_;
            auVar63._16_4_ = auVar107._16_4_ * 0.0;
            auVar63._20_4_ = auVar107._20_4_ * 0.0;
            auVar63._24_4_ = auVar107._24_4_ * 0.0;
            auVar63._28_4_ = auVar107._28_4_;
            auVar10 = vfmsub231ps_fma(auVar63,ZEXT1632(auVar11),auVar106);
            auVar106 = vfmadd231ps_avx512vl(ZEXT1632(auVar10),auVar103,ZEXT1632(auVar9));
            auVar106 = vfmadd231ps_avx512vl(auVar106,auVar103,ZEXT1632(auVar94));
            uVar92 = vcmpps_avx512vl(auVar106,auVar103,2);
            bVar83 = (byte)uVar92;
            fVar160 = (float)((uint)(bVar83 & 1) * auVar96._0_4_ |
                             (uint)!(bool)(bVar83 & 1) * auVar98._0_4_);
            bVar17 = (bool)((byte)(uVar92 >> 1) & 1);
            fVar139 = (float)((uint)bVar17 * auVar96._4_4_ | (uint)!bVar17 * auVar98._4_4_);
            bVar17 = (bool)((byte)(uVar92 >> 2) & 1);
            fVar141 = (float)((uint)bVar17 * auVar96._8_4_ | (uint)!bVar17 * auVar98._8_4_);
            bVar17 = (bool)((byte)(uVar92 >> 3) & 1);
            fVar143 = (float)((uint)bVar17 * auVar96._12_4_ | (uint)!bVar17 * auVar98._12_4_);
            auVar109 = ZEXT1632(CONCAT412(fVar143,CONCAT48(fVar141,CONCAT44(fVar139,fVar160))));
            fVar138 = (float)((uint)(bVar83 & 1) * auVar6._0_4_ |
                             (uint)!(bool)(bVar83 & 1) * auVar155._0_4_);
            bVar17 = (bool)((byte)(uVar92 >> 1) & 1);
            fVar140 = (float)((uint)bVar17 * auVar6._4_4_ | (uint)!bVar17 * auVar155._4_4_);
            bVar17 = (bool)((byte)(uVar92 >> 2) & 1);
            fVar142 = (float)((uint)bVar17 * auVar6._8_4_ | (uint)!bVar17 * auVar155._8_4_);
            bVar17 = (bool)((byte)(uVar92 >> 3) & 1);
            fVar144 = (float)((uint)bVar17 * auVar6._12_4_ | (uint)!bVar17 * auVar155._12_4_);
            auVar111 = ZEXT1632(CONCAT412(fVar144,CONCAT48(fVar142,CONCAT44(fVar140,fVar138))));
            auVar133._0_4_ =
                 (float)((uint)(bVar83 & 1) * auVar117._0_4_ |
                        (uint)!(bool)(bVar83 & 1) * auVar157._0_4_);
            bVar17 = (bool)((byte)(uVar92 >> 1) & 1);
            auVar133._4_4_ = (float)((uint)bVar17 * auVar117._4_4_ | (uint)!bVar17 * auVar157._4_4_)
            ;
            bVar17 = (bool)((byte)(uVar92 >> 2) & 1);
            auVar133._8_4_ = (float)((uint)bVar17 * auVar117._8_4_ | (uint)!bVar17 * auVar157._8_4_)
            ;
            bVar17 = (bool)((byte)(uVar92 >> 3) & 1);
            auVar133._12_4_ =
                 (float)((uint)bVar17 * auVar117._12_4_ | (uint)!bVar17 * auVar157._12_4_);
            fVar168 = (float)((uint)((byte)(uVar92 >> 4) & 1) * auVar117._16_4_);
            auVar133._16_4_ = fVar168;
            fVar145 = (float)((uint)((byte)(uVar92 >> 5) & 1) * auVar117._20_4_);
            auVar133._20_4_ = fVar145;
            fVar167 = (float)((uint)((byte)(uVar92 >> 6) & 1) * auVar117._24_4_);
            auVar133._24_4_ = fVar167;
            iVar1 = (uint)(byte)(uVar92 >> 7) * auVar117._28_4_;
            auVar133._28_4_ = iVar1;
            auVar106 = vblendmps_avx512vl(ZEXT1632(auVar11),auVar115);
            auVar134._0_4_ =
                 (uint)(bVar83 & 1) * auVar106._0_4_ | (uint)!(bool)(bVar83 & 1) * auVar94._0_4_;
            bVar17 = (bool)((byte)(uVar92 >> 1) & 1);
            auVar134._4_4_ = (uint)bVar17 * auVar106._4_4_ | (uint)!bVar17 * auVar94._4_4_;
            bVar17 = (bool)((byte)(uVar92 >> 2) & 1);
            auVar134._8_4_ = (uint)bVar17 * auVar106._8_4_ | (uint)!bVar17 * auVar94._8_4_;
            bVar17 = (bool)((byte)(uVar92 >> 3) & 1);
            auVar134._12_4_ = (uint)bVar17 * auVar106._12_4_ | (uint)!bVar17 * auVar94._12_4_;
            auVar134._16_4_ = (uint)((byte)(uVar92 >> 4) & 1) * auVar106._16_4_;
            auVar134._20_4_ = (uint)((byte)(uVar92 >> 5) & 1) * auVar106._20_4_;
            auVar134._24_4_ = (uint)((byte)(uVar92 >> 6) & 1) * auVar106._24_4_;
            auVar134._28_4_ = (uint)(byte)(uVar92 >> 7) * auVar106._28_4_;
            auVar106 = vblendmps_avx512vl(ZEXT1632(auVar97),ZEXT1632(auVar7));
            auVar135._0_4_ =
                 (float)((uint)(bVar83 & 1) * auVar106._0_4_ |
                        (uint)!(bool)(bVar83 & 1) * auVar96._0_4_);
            bVar17 = (bool)((byte)(uVar92 >> 1) & 1);
            auVar135._4_4_ = (float)((uint)bVar17 * auVar106._4_4_ | (uint)!bVar17 * auVar96._4_4_);
            bVar17 = (bool)((byte)(uVar92 >> 2) & 1);
            auVar135._8_4_ = (float)((uint)bVar17 * auVar106._8_4_ | (uint)!bVar17 * auVar96._8_4_);
            bVar17 = (bool)((byte)(uVar92 >> 3) & 1);
            auVar135._12_4_ =
                 (float)((uint)bVar17 * auVar106._12_4_ | (uint)!bVar17 * auVar96._12_4_);
            fVar175 = (float)((uint)((byte)(uVar92 >> 4) & 1) * auVar106._16_4_);
            auVar135._16_4_ = fVar175;
            fVar174 = (float)((uint)((byte)(uVar92 >> 5) & 1) * auVar106._20_4_);
            auVar135._20_4_ = fVar174;
            fVar173 = (float)((uint)((byte)(uVar92 >> 6) & 1) * auVar106._24_4_);
            auVar135._24_4_ = fVar173;
            auVar135._28_4_ = (uint)(byte)(uVar92 >> 7) * auVar106._28_4_;
            auVar106 = vblendmps_avx512vl(ZEXT1632(auVar99),ZEXT1632(auVar8));
            auVar136._0_4_ =
                 (float)((uint)(bVar83 & 1) * auVar106._0_4_ |
                        (uint)!(bool)(bVar83 & 1) * auVar6._0_4_);
            bVar17 = (bool)((byte)(uVar92 >> 1) & 1);
            auVar136._4_4_ = (float)((uint)bVar17 * auVar106._4_4_ | (uint)!bVar17 * auVar6._4_4_);
            bVar17 = (bool)((byte)(uVar92 >> 2) & 1);
            auVar136._8_4_ = (float)((uint)bVar17 * auVar106._8_4_ | (uint)!bVar17 * auVar6._8_4_);
            bVar17 = (bool)((byte)(uVar92 >> 3) & 1);
            auVar136._12_4_ =
                 (float)((uint)bVar17 * auVar106._12_4_ | (uint)!bVar17 * auVar6._12_4_);
            fVar93 = (float)((uint)((byte)(uVar92 >> 4) & 1) * auVar106._16_4_);
            auVar136._16_4_ = fVar93;
            fVar161 = (float)((uint)((byte)(uVar92 >> 5) & 1) * auVar106._20_4_);
            auVar136._20_4_ = fVar161;
            fVar166 = (float)((uint)((byte)(uVar92 >> 6) & 1) * auVar106._24_4_);
            auVar136._24_4_ = fVar166;
            iVar2 = (uint)(byte)(uVar92 >> 7) * auVar106._28_4_;
            auVar136._28_4_ = iVar2;
            auVar137._0_4_ =
                 (uint)(bVar83 & 1) * (int)auVar11._0_4_ |
                 (uint)!(bool)(bVar83 & 1) * auVar115._0_4_;
            bVar17 = (bool)((byte)(uVar92 >> 1) & 1);
            auVar137._4_4_ = (uint)bVar17 * (int)auVar11._4_4_ | (uint)!bVar17 * auVar115._4_4_;
            bVar17 = (bool)((byte)(uVar92 >> 2) & 1);
            auVar137._8_4_ = (uint)bVar17 * (int)auVar11._8_4_ | (uint)!bVar17 * auVar115._8_4_;
            bVar17 = (bool)((byte)(uVar92 >> 3) & 1);
            auVar137._12_4_ = (uint)bVar17 * (int)auVar11._12_4_ | (uint)!bVar17 * auVar115._12_4_;
            auVar137._16_4_ = (uint)!(bool)((byte)(uVar92 >> 4) & 1) * auVar115._16_4_;
            auVar137._20_4_ = (uint)!(bool)((byte)(uVar92 >> 5) & 1) * auVar115._20_4_;
            auVar137._24_4_ = (uint)!(bool)((byte)(uVar92 >> 6) & 1) * auVar115._24_4_;
            auVar137._28_4_ = (uint)!SUB81(uVar92 >> 7,0) * auVar115._28_4_;
            bVar17 = (bool)((byte)(uVar92 >> 1) & 1);
            bVar19 = (bool)((byte)(uVar92 >> 2) & 1);
            bVar21 = (bool)((byte)(uVar92 >> 3) & 1);
            bVar18 = (bool)((byte)(uVar92 >> 1) & 1);
            bVar20 = (bool)((byte)(uVar92 >> 2) & 1);
            bVar22 = (bool)((byte)(uVar92 >> 3) & 1);
            auVar115 = vsubps_avx512vl(auVar137,auVar109);
            auVar105 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar21 * (int)auVar97._12_4_ |
                                                     (uint)!bVar21 * auVar7._12_4_,
                                                     CONCAT48((uint)bVar19 * (int)auVar97._8_4_ |
                                                              (uint)!bVar19 * auVar7._8_4_,
                                                              CONCAT44((uint)bVar17 *
                                                                       (int)auVar97._4_4_ |
                                                                       (uint)!bVar17 * auVar7._4_4_,
                                                                       (uint)(bVar83 & 1) *
                                                                       (int)auVar97._0_4_ |
                                                                       (uint)!(bool)(bVar83 & 1) *
                                                                       auVar7._0_4_)))),auVar111);
            auVar117 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar22 * (int)auVar99._12_4_ |
                                                     (uint)!bVar22 * auVar8._12_4_,
                                                     CONCAT48((uint)bVar20 * (int)auVar99._8_4_ |
                                                              (uint)!bVar20 * auVar8._8_4_,
                                                              CONCAT44((uint)bVar18 *
                                                                       (int)auVar99._4_4_ |
                                                                       (uint)!bVar18 * auVar8._4_4_,
                                                                       (uint)(bVar83 & 1) *
                                                                       (int)auVar99._0_4_ |
                                                                       (uint)!(bool)(bVar83 & 1) *
                                                                       auVar8._0_4_)))),auVar133);
            auVar116 = vsubps_avx(auVar109,auVar134);
            auVar107 = vsubps_avx(auVar111,auVar135);
            auVar108 = vsubps_avx(auVar133,auVar136);
            auVar64._4_4_ = auVar117._4_4_ * fVar139;
            auVar64._0_4_ = auVar117._0_4_ * fVar160;
            auVar64._8_4_ = auVar117._8_4_ * fVar141;
            auVar64._12_4_ = auVar117._12_4_ * fVar143;
            auVar64._16_4_ = auVar117._16_4_ * 0.0;
            auVar64._20_4_ = auVar117._20_4_ * 0.0;
            auVar64._24_4_ = auVar117._24_4_ * 0.0;
            auVar64._28_4_ = 0;
            auVar94 = vfmsub231ps_fma(auVar64,auVar133,auVar115);
            auVar165._0_4_ = fVar138 * auVar115._0_4_;
            auVar165._4_4_ = fVar140 * auVar115._4_4_;
            auVar165._8_4_ = fVar142 * auVar115._8_4_;
            auVar165._12_4_ = fVar144 * auVar115._12_4_;
            auVar165._16_4_ = auVar115._16_4_ * 0.0;
            auVar165._20_4_ = auVar115._20_4_ * 0.0;
            auVar165._24_4_ = auVar115._24_4_ * 0.0;
            auVar165._28_4_ = 0;
            auVar96 = vfmsub231ps_fma(auVar165,auVar109,auVar105);
            auVar106 = vfmadd231ps_avx512vl(ZEXT1632(auVar96),auVar103,ZEXT1632(auVar94));
            auVar171._0_4_ = auVar105._0_4_ * auVar133._0_4_;
            auVar171._4_4_ = auVar105._4_4_ * auVar133._4_4_;
            auVar171._8_4_ = auVar105._8_4_ * auVar133._8_4_;
            auVar171._12_4_ = auVar105._12_4_ * auVar133._12_4_;
            auVar171._16_4_ = auVar105._16_4_ * fVar168;
            auVar171._20_4_ = auVar105._20_4_ * fVar145;
            auVar171._24_4_ = auVar105._24_4_ * fVar167;
            auVar171._28_4_ = 0;
            auVar94 = vfmsub231ps_fma(auVar171,auVar111,auVar117);
            auVar110 = vfmadd231ps_avx512vl(auVar106,auVar103,ZEXT1632(auVar94));
            auVar106 = vmulps_avx512vl(auVar108,auVar134);
            auVar106 = vfmsub231ps_avx512vl(auVar106,auVar116,auVar136);
            auVar65._4_4_ = auVar107._4_4_ * auVar136._4_4_;
            auVar65._0_4_ = auVar107._0_4_ * auVar136._0_4_;
            auVar65._8_4_ = auVar107._8_4_ * auVar136._8_4_;
            auVar65._12_4_ = auVar107._12_4_ * auVar136._12_4_;
            auVar65._16_4_ = auVar107._16_4_ * fVar93;
            auVar65._20_4_ = auVar107._20_4_ * fVar161;
            auVar65._24_4_ = auVar107._24_4_ * fVar166;
            auVar65._28_4_ = iVar2;
            auVar94 = vfmsub231ps_fma(auVar65,auVar135,auVar108);
            auVar172._0_4_ = auVar135._0_4_ * auVar116._0_4_;
            auVar172._4_4_ = auVar135._4_4_ * auVar116._4_4_;
            auVar172._8_4_ = auVar135._8_4_ * auVar116._8_4_;
            auVar172._12_4_ = auVar135._12_4_ * auVar116._12_4_;
            auVar172._16_4_ = fVar175 * auVar116._16_4_;
            auVar172._20_4_ = fVar174 * auVar116._20_4_;
            auVar172._24_4_ = fVar173 * auVar116._24_4_;
            auVar172._28_4_ = 0;
            auVar96 = vfmsub231ps_fma(auVar172,auVar107,auVar134);
            auVar106 = vfmadd231ps_avx512vl(ZEXT1632(auVar96),auVar103,auVar106);
            auVar104 = vfmadd231ps_avx512vl(auVar106,auVar103,ZEXT1632(auVar94));
            auVar106 = vmaxps_avx(auVar110,auVar104);
            uVar147 = vcmpps_avx512vl(auVar106,auVar103,2);
            local_230 = local_230 & (byte)uVar147;
            auVar200 = ZEXT3264(auVar156);
            if (local_230 == 0) {
LAB_01e760c6:
              local_230 = 0;
            }
            else {
              auVar66._4_4_ = auVar108._4_4_ * auVar105._4_4_;
              auVar66._0_4_ = auVar108._0_4_ * auVar105._0_4_;
              auVar66._8_4_ = auVar108._8_4_ * auVar105._8_4_;
              auVar66._12_4_ = auVar108._12_4_ * auVar105._12_4_;
              auVar66._16_4_ = auVar108._16_4_ * auVar105._16_4_;
              auVar66._20_4_ = auVar108._20_4_ * auVar105._20_4_;
              auVar66._24_4_ = auVar108._24_4_ * auVar105._24_4_;
              auVar66._28_4_ = auVar106._28_4_;
              auVar6 = vfmsub231ps_fma(auVar66,auVar107,auVar117);
              auVar67._4_4_ = auVar117._4_4_ * auVar116._4_4_;
              auVar67._0_4_ = auVar117._0_4_ * auVar116._0_4_;
              auVar67._8_4_ = auVar117._8_4_ * auVar116._8_4_;
              auVar67._12_4_ = auVar117._12_4_ * auVar116._12_4_;
              auVar67._16_4_ = auVar117._16_4_ * auVar116._16_4_;
              auVar67._20_4_ = auVar117._20_4_ * auVar116._20_4_;
              auVar67._24_4_ = auVar117._24_4_ * auVar116._24_4_;
              auVar67._28_4_ = auVar117._28_4_;
              auVar96 = vfmsub231ps_fma(auVar67,auVar115,auVar108);
              auVar68._4_4_ = auVar107._4_4_ * auVar115._4_4_;
              auVar68._0_4_ = auVar107._0_4_ * auVar115._0_4_;
              auVar68._8_4_ = auVar107._8_4_ * auVar115._8_4_;
              auVar68._12_4_ = auVar107._12_4_ * auVar115._12_4_;
              auVar68._16_4_ = auVar107._16_4_ * auVar115._16_4_;
              auVar68._20_4_ = auVar107._20_4_ * auVar115._20_4_;
              auVar68._24_4_ = auVar107._24_4_ * auVar115._24_4_;
              auVar68._28_4_ = auVar107._28_4_;
              auVar7 = vfmsub231ps_fma(auVar68,auVar116,auVar105);
              auVar94 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar96),ZEXT1632(auVar7));
              auVar106 = vfmadd231ps_avx512vl(ZEXT1632(auVar94),ZEXT1632(auVar6),auVar103);
              auVar105 = vrcp14ps_avx512vl(auVar106);
              auVar31._8_4_ = 0x3f800000;
              auVar31._0_8_ = &DAT_3f8000003f800000;
              auVar31._12_4_ = 0x3f800000;
              auVar31._16_4_ = 0x3f800000;
              auVar31._20_4_ = 0x3f800000;
              auVar31._24_4_ = 0x3f800000;
              auVar31._28_4_ = 0x3f800000;
              auVar117 = vfnmadd213ps_avx512vl(auVar105,auVar106,auVar31);
              auVar94 = vfmadd132ps_fma(auVar117,auVar105,auVar105);
              auVar69._4_4_ = auVar7._4_4_ * auVar133._4_4_;
              auVar69._0_4_ = auVar7._0_4_ * auVar133._0_4_;
              auVar69._8_4_ = auVar7._8_4_ * auVar133._8_4_;
              auVar69._12_4_ = auVar7._12_4_ * auVar133._12_4_;
              auVar69._16_4_ = fVar168 * 0.0;
              auVar69._20_4_ = fVar145 * 0.0;
              auVar69._24_4_ = fVar167 * 0.0;
              auVar69._28_4_ = iVar1;
              auVar96 = vfmadd231ps_fma(auVar69,auVar111,ZEXT1632(auVar96));
              auVar96 = vfmadd231ps_fma(ZEXT1632(auVar96),auVar109,ZEXT1632(auVar6));
              fVar168 = auVar94._0_4_;
              fVar145 = auVar94._4_4_;
              fVar167 = auVar94._8_4_;
              fVar173 = auVar94._12_4_;
              auVar105 = ZEXT1632(CONCAT412(auVar96._12_4_ * fVar173,
                                            CONCAT48(auVar96._8_4_ * fVar167,
                                                     CONCAT44(auVar96._4_4_ * fVar145,
                                                              auVar96._0_4_ * fVar168))));
              auVar81._4_4_ = uStack_39c;
              auVar81._0_4_ = local_3a0;
              auVar81._8_4_ = uStack_398;
              auVar81._12_4_ = uStack_394;
              auVar81._16_4_ = uStack_390;
              auVar81._20_4_ = uStack_38c;
              auVar81._24_4_ = uStack_388;
              auVar81._28_4_ = uStack_384;
              uVar147 = vcmpps_avx512vl(auVar105,auVar81,0xd);
              uVar146 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar32._4_4_ = uVar146;
              auVar32._0_4_ = uVar146;
              auVar32._8_4_ = uVar146;
              auVar32._12_4_ = uVar146;
              auVar32._16_4_ = uVar146;
              auVar32._20_4_ = uVar146;
              auVar32._24_4_ = uVar146;
              auVar32._28_4_ = uVar146;
              uVar24 = vcmpps_avx512vl(auVar105,auVar32,2);
              local_230 = (byte)uVar147 & (byte)uVar24 & local_230;
              if (local_230 == 0) goto LAB_01e760c6;
              uVar147 = vcmpps_avx512vl(auVar106,auVar103,4);
              if ((local_230 & (byte)uVar147) == 0) {
                local_230 = 0;
              }
              else {
                local_230 = local_230 & (byte)uVar147;
                fVar174 = auVar110._0_4_ * fVar168;
                fVar175 = auVar110._4_4_ * fVar145;
                auVar70._4_4_ = fVar175;
                auVar70._0_4_ = fVar174;
                fVar161 = auVar110._8_4_ * fVar167;
                auVar70._8_4_ = fVar161;
                fVar166 = auVar110._12_4_ * fVar173;
                auVar70._12_4_ = fVar166;
                fVar93 = auVar110._16_4_ * 0.0;
                auVar70._16_4_ = fVar93;
                fVar160 = auVar110._20_4_ * 0.0;
                auVar70._20_4_ = fVar160;
                fVar138 = auVar110._24_4_ * 0.0;
                auVar70._24_4_ = fVar138;
                auVar70._28_4_ = auVar110._28_4_;
                fVar168 = auVar104._0_4_ * fVar168;
                fVar145 = auVar104._4_4_ * fVar145;
                auVar71._4_4_ = fVar145;
                auVar71._0_4_ = fVar168;
                fVar167 = auVar104._8_4_ * fVar167;
                auVar71._8_4_ = fVar167;
                fVar173 = auVar104._12_4_ * fVar173;
                auVar71._12_4_ = fVar173;
                fVar139 = auVar104._16_4_ * 0.0;
                auVar71._16_4_ = fVar139;
                fVar140 = auVar104._20_4_ * 0.0;
                auVar71._20_4_ = fVar140;
                fVar141 = auVar104._24_4_ * 0.0;
                auVar71._24_4_ = fVar141;
                auVar71._28_4_ = auVar104._28_4_;
                auVar181._8_4_ = 0x3f800000;
                auVar181._0_8_ = &DAT_3f8000003f800000;
                auVar181._12_4_ = 0x3f800000;
                auVar181._16_4_ = 0x3f800000;
                auVar181._20_4_ = 0x3f800000;
                auVar181._24_4_ = 0x3f800000;
                auVar181._28_4_ = 0x3f800000;
                auVar106 = vsubps_avx(auVar181,auVar70);
                local_540._0_4_ =
                     (uint)(bVar83 & 1) * (int)fVar174 | (uint)!(bool)(bVar83 & 1) * auVar106._0_4_;
                bVar17 = (bool)((byte)(uVar92 >> 1) & 1);
                local_540._4_4_ = (uint)bVar17 * (int)fVar175 | (uint)!bVar17 * auVar106._4_4_;
                bVar17 = (bool)((byte)(uVar92 >> 2) & 1);
                local_540._8_4_ = (uint)bVar17 * (int)fVar161 | (uint)!bVar17 * auVar106._8_4_;
                bVar17 = (bool)((byte)(uVar92 >> 3) & 1);
                local_540._12_4_ = (uint)bVar17 * (int)fVar166 | (uint)!bVar17 * auVar106._12_4_;
                bVar17 = (bool)((byte)(uVar92 >> 4) & 1);
                local_540._16_4_ = (uint)bVar17 * (int)fVar93 | (uint)!bVar17 * auVar106._16_4_;
                bVar17 = (bool)((byte)(uVar92 >> 5) & 1);
                local_540._20_4_ = (uint)bVar17 * (int)fVar160 | (uint)!bVar17 * auVar106._20_4_;
                bVar17 = (bool)((byte)(uVar92 >> 6) & 1);
                local_540._24_4_ = (uint)bVar17 * (int)fVar138 | (uint)!bVar17 * auVar106._24_4_;
                bVar17 = SUB81(uVar92 >> 7,0);
                local_540._28_4_ = (uint)bVar17 * auVar110._28_4_ | (uint)!bVar17 * auVar106._28_4_;
                auVar106 = vsubps_avx(auVar181,auVar71);
                bVar17 = (bool)((byte)(uVar92 >> 1) & 1);
                bVar18 = (bool)((byte)(uVar92 >> 2) & 1);
                bVar19 = (bool)((byte)(uVar92 >> 3) & 1);
                bVar20 = (bool)((byte)(uVar92 >> 4) & 1);
                bVar21 = (bool)((byte)(uVar92 >> 5) & 1);
                bVar22 = (bool)((byte)(uVar92 >> 6) & 1);
                bVar23 = SUB81(uVar92 >> 7,0);
                local_1c0._4_4_ = (uint)bVar17 * (int)fVar145 | (uint)!bVar17 * auVar106._4_4_;
                local_1c0._0_4_ =
                     (uint)(bVar83 & 1) * (int)fVar168 | (uint)!(bool)(bVar83 & 1) * auVar106._0_4_;
                local_1c0._8_4_ = (uint)bVar18 * (int)fVar167 | (uint)!bVar18 * auVar106._8_4_;
                local_1c0._12_4_ = (uint)bVar19 * (int)fVar173 | (uint)!bVar19 * auVar106._12_4_;
                local_1c0._16_4_ = (uint)bVar20 * (int)fVar139 | (uint)!bVar20 * auVar106._16_4_;
                local_1c0._20_4_ = (uint)bVar21 * (int)fVar140 | (uint)!bVar21 * auVar106._20_4_;
                local_1c0._24_4_ = (uint)bVar22 * (int)fVar141 | (uint)!bVar22 * auVar106._24_4_;
                local_1c0._28_4_ = (uint)bVar23 * auVar104._28_4_ | (uint)!bVar23 * auVar106._28_4_;
                local_560 = auVar105;
              }
            }
            auVar209 = ZEXT3264(local_5c0);
            if (local_230 != 0) {
              auVar106 = vsubps_avx(ZEXT1632(auVar95),auVar112);
              auVar94 = vfmadd213ps_fma(auVar106,local_540,auVar112);
              uVar146 = *(undefined4 *)((long)local_6a8->ray_space + k * 4 + -0x10);
              auVar33._4_4_ = uVar146;
              auVar33._0_4_ = uVar146;
              auVar33._8_4_ = uVar146;
              auVar33._12_4_ = uVar146;
              auVar33._16_4_ = uVar146;
              auVar33._20_4_ = uVar146;
              auVar33._24_4_ = uVar146;
              auVar33._28_4_ = uVar146;
              auVar106 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar94._12_4_ + auVar94._12_4_,
                                                            CONCAT48(auVar94._8_4_ + auVar94._8_4_,
                                                                     CONCAT44(auVar94._4_4_ +
                                                                              auVar94._4_4_,
                                                                              auVar94._0_4_ +
                                                                              auVar94._0_4_)))),
                                         auVar33);
              uVar147 = vcmpps_avx512vl(local_560,auVar106,6);
              local_230 = local_230 & (byte)uVar147;
              if (local_230 != 0) {
                auVar154._8_4_ = 0xbf800000;
                auVar154._0_8_ = 0xbf800000bf800000;
                auVar154._12_4_ = 0xbf800000;
                auVar154._16_4_ = 0xbf800000;
                auVar154._20_4_ = 0xbf800000;
                auVar154._24_4_ = 0xbf800000;
                auVar154._28_4_ = 0xbf800000;
                auVar34._8_4_ = 0x40000000;
                auVar34._0_8_ = 0x4000000040000000;
                auVar34._12_4_ = 0x40000000;
                auVar34._16_4_ = 0x40000000;
                auVar34._20_4_ = 0x40000000;
                auVar34._24_4_ = 0x40000000;
                auVar34._28_4_ = 0x40000000;
                local_2c0 = vfmadd132ps_avx512vl(local_1c0,auVar154,auVar34);
                local_1c0 = local_2c0;
                auVar106 = local_1c0;
                local_280 = (undefined4)lVar91;
                local_270 = local_610._0_8_;
                uStack_268 = local_610._8_8_;
                local_260 = local_3f0._0_8_;
                uStack_258 = local_3f0._8_8_;
                local_250 = local_400._0_8_;
                uStack_248 = local_400._8_8_;
                local_240 = local_410._0_8_;
                uStack_238 = local_410._8_8_;
                pGVar88 = (context->scene->geometries).items[local_6b8].ptr;
                if ((pGVar88->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                  bVar83 = 0;
                }
                else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                        (bVar83 = 1, pGVar88->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_180 = vmovdqa64_avx512vl(auVar195._0_32_);
                  auVar94 = vcvtsi2ss_avx512f(auVar201._0_16_,local_280);
                  fVar168 = auVar94._0_4_;
                  local_220[0] = (fVar168 + local_540._0_4_ + 0.0) * (float)local_3c0;
                  local_220[1] = (fVar168 + local_540._4_4_ + 1.0) * local_3c0._4_4_;
                  local_220[2] = (fVar168 + local_540._8_4_ + 2.0) * fStack_3b8;
                  local_220[3] = (fVar168 + local_540._12_4_ + 3.0) * fStack_3b4;
                  fStack_210 = (fVar168 + local_540._16_4_ + 4.0) * fStack_3b0;
                  fStack_20c = (fVar168 + local_540._20_4_ + 5.0) * fStack_3ac;
                  fStack_208 = (fVar168 + local_540._24_4_ + 6.0) * fStack_3a8;
                  fStack_204 = fVar168 + local_540._28_4_ + 7.0;
                  local_1c0._0_8_ = local_2c0._0_8_;
                  local_1c0._8_8_ = local_2c0._8_8_;
                  local_1c0._16_8_ = local_2c0._16_8_;
                  local_1c0._24_8_ = local_2c0._24_8_;
                  local_200 = local_1c0._0_8_;
                  uStack_1f8 = local_1c0._8_8_;
                  uStack_1f0 = local_1c0._16_8_;
                  uStack_1e8 = local_1c0._24_8_;
                  local_1e0 = local_560;
                  local_580 = local_3f0._0_8_;
                  uStack_578 = local_3f0._8_8_;
                  uVar92 = 0;
                  uVar85 = (ulong)local_230;
                  for (uVar87 = uVar85; (uVar87 & 1) == 0; uVar87 = uVar87 >> 1 | 0x8000000000000000
                      ) {
                    uVar92 = uVar92 + 1;
                  }
                  local_590 = local_400._0_4_;
                  fStack_58c = local_400._4_4_;
                  fStack_588 = local_400._8_4_;
                  fStack_584 = local_400._12_4_;
                  _local_670 = local_410;
                  local_660._0_4_ = 1;
                  local_6b0 = pGVar88;
                  local_2e0 = local_540;
                  local_2a0 = local_560;
                  local_27c = iVar13;
                  local_1c0 = auVar106;
                  do {
                    local_650 = *(undefined4 *)(ray + k * 4 + 0x80);
                    local_340 = local_220[uVar92];
                    local_330 = *(undefined4 *)((long)&local_200 + uVar92 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1e0 + uVar92 * 4);
                    local_6a0.context = context->user;
                    fVar145 = 1.0 - local_340;
                    fVar168 = fVar145 * fVar145 * -3.0;
                    auVar94 = vfmadd231ss_fma(ZEXT416((uint)(fVar145 * fVar145)),
                                              ZEXT416((uint)(local_340 * fVar145)),
                                              ZEXT416(0xc0000000));
                    auVar95 = vfmsub132ss_fma(ZEXT416((uint)(local_340 * fVar145)),
                                              ZEXT416((uint)(local_340 * local_340)),
                                              ZEXT416(0x40000000));
                    fVar145 = auVar94._0_4_ * 3.0;
                    fVar167 = auVar95._0_4_ * 3.0;
                    fVar173 = local_340 * local_340 * 3.0;
                    auVar177._0_4_ = fVar173 * (float)local_670._0_4_;
                    auVar177._4_4_ = fVar173 * (float)local_670._4_4_;
                    auVar177._8_4_ = fVar173 * fStack_668;
                    auVar177._12_4_ = fVar173 * fStack_664;
                    auVar150._4_4_ = fVar167;
                    auVar150._0_4_ = fVar167;
                    auVar150._8_4_ = fVar167;
                    auVar150._12_4_ = fVar167;
                    auVar77._4_4_ = fStack_58c;
                    auVar77._0_4_ = local_590;
                    auVar77._8_4_ = fStack_588;
                    auVar77._12_4_ = fStack_584;
                    auVar94 = vfmadd132ps_fma(auVar150,auVar177,auVar77);
                    auVar163._4_4_ = fVar145;
                    auVar163._0_4_ = fVar145;
                    auVar163._8_4_ = fVar145;
                    auVar163._12_4_ = fVar145;
                    auVar79._8_8_ = uStack_578;
                    auVar79._0_8_ = local_580;
                    auVar94 = vfmadd132ps_fma(auVar163,auVar94,auVar79);
                    auVar151._4_4_ = fVar168;
                    auVar151._0_4_ = fVar168;
                    auVar151._8_4_ = fVar168;
                    auVar151._12_4_ = fVar168;
                    auVar94 = vfmadd132ps_fma(auVar151,auVar94,local_610);
                    local_370 = auVar94._0_4_;
                    local_360 = vshufps_avx(auVar94,auVar94,0x55);
                    local_350 = vshufps_avx(auVar94,auVar94,0xaa);
                    local_320 = local_620._0_8_;
                    uStack_318 = local_620._8_8_;
                    local_310 = local_630;
                    vpcmpeqd_avx2(ZEXT1632(local_630),ZEXT1632(local_630));
                    uStack_2fc = (local_6a0.context)->instID[0];
                    local_300 = uStack_2fc;
                    uStack_2f8 = uStack_2fc;
                    uStack_2f4 = uStack_2fc;
                    uStack_2f0 = (local_6a0.context)->instPrimID[0];
                    uStack_2ec = uStack_2f0;
                    uStack_2e8 = uStack_2f0;
                    uStack_2e4 = uStack_2f0;
                    local_6d0 = local_420._0_8_;
                    uStack_6c8 = local_420._8_8_;
                    local_6a0.valid = (int *)&local_6d0;
                    local_6a0.geometryUserPtr = pGVar88->userPtr;
                    local_6a0.hit = (RTCHitN *)&local_370;
                    local_6a0.N = 4;
                    pRVar82 = (RayK<4> *)pGVar88->occlusionFilterN;
                    local_640._0_8_ = uVar92;
                    uVar87 = uVar92;
                    local_6a0.ray = (RTCRayN *)ray;
                    uStack_36c = local_370;
                    uStack_368 = local_370;
                    uStack_364 = local_370;
                    fStack_33c = local_340;
                    fStack_338 = local_340;
                    fStack_334 = local_340;
                    uStack_32c = local_330;
                    uStack_328 = local_330;
                    uStack_324 = local_330;
                    if (pRVar82 != (RayK<4> *)0x0) {
                      pRVar82 = (RayK<4> *)(*(code *)pRVar82)(&local_6a0);
                      uVar87 = local_640._0_8_;
                      pGVar88 = local_6b0;
                    }
                    auVar74._8_8_ = uStack_6c8;
                    auVar74._0_8_ = local_6d0;
                    uVar92 = vptestmd_avx512vl(auVar74,auVar74);
                    if ((uVar92 & 0xf) != 0) {
                      p_Var16 = context->args->filter;
                      if ((p_Var16 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar88->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var16)(&local_6a0);
                        uVar87 = local_640._0_8_;
                        pGVar88 = local_6b0;
                      }
                      auVar96 = auVar205._0_16_;
                      auVar75._8_8_ = uStack_6c8;
                      auVar75._0_8_ = local_6d0;
                      auVar94 = *(undefined1 (*) [16])(local_6a0.ray + 0x80);
                      uVar92 = vptestmd_avx512vl(auVar75,auVar75);
                      uVar92 = uVar92 & 0xf;
                      auVar95 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                      bVar17 = (bool)((byte)uVar92 & 1);
                      auVar101._0_4_ = (uint)bVar17 * auVar95._0_4_ | (uint)!bVar17 * auVar94._0_4_;
                      bVar17 = (bool)((byte)(uVar92 >> 1) & 1);
                      auVar101._4_4_ = (uint)bVar17 * auVar95._4_4_ | (uint)!bVar17 * auVar94._4_4_;
                      bVar17 = (bool)((byte)(uVar92 >> 2) & 1);
                      auVar101._8_4_ = (uint)bVar17 * auVar95._8_4_ | (uint)!bVar17 * auVar94._8_4_;
                      bVar17 = SUB81(uVar92 >> 3,0);
                      auVar101._12_4_ =
                           (uint)bVar17 * auVar95._12_4_ | (uint)!bVar17 * auVar94._12_4_;
                      *(undefined1 (*) [16])(local_6a0.ray + 0x80) = auVar101;
                      pRVar82 = (RayK<4> *)local_6a0.ray;
                      if ((byte)uVar92 != 0) break;
                    }
                    auVar96 = auVar205._0_16_;
                    *(undefined4 *)(ray + k * 4 + 0x80) = local_650;
                    uVar92 = 0;
                    uVar85 = uVar85 ^ 1L << (uVar87 & 0x3f);
                    for (uVar87 = uVar85; (uVar87 & 1) == 0;
                        uVar87 = uVar87 >> 1 | 0x8000000000000000) {
                      uVar92 = uVar92 + 1;
                    }
                    local_660._0_4_ = (int)CONCAT71((int7)((ulong)pRVar82 >> 8),uVar85 != 0);
                  } while (uVar85 != 0);
                  bVar83 = local_660[0] & 1;
                  auVar94 = vxorps_avx512vl(auVar96,auVar96);
                  auVar205 = ZEXT1664(auVar94);
                  auVar202 = ZEXT3264(local_440);
                  auVar203 = ZEXT3264(local_3e0);
                  auVar204 = ZEXT3264(local_460);
                  auVar200 = ZEXT3264(local_480);
                  auVar209 = ZEXT3264(local_5c0);
                  auVar206 = ZEXT3264(local_4c0);
                  auVar207 = ZEXT3264(local_4e0);
                  auVar208 = ZEXT3264(local_500);
                  auVar106 = vmovdqa64_avx512vl(local_180);
                  auVar195 = ZEXT3264(auVar106);
                }
                bVar89 = (bool)(bVar89 | bVar83);
              }
            }
          }
          lVar91 = lVar91 + 8;
          auVar201 = auVar200;
        } while ((int)lVar91 < iVar13);
      }
      if (bVar89 != false) {
        return local_6e9;
      }
      uVar146 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar30._4_4_ = uVar146;
      auVar30._0_4_ = uVar146;
      auVar30._8_4_ = uVar146;
      auVar30._12_4_ = uVar146;
      auVar30._16_4_ = uVar146;
      auVar30._20_4_ = uVar146;
      auVar30._24_4_ = uVar146;
      auVar30._28_4_ = uVar146;
      uVar147 = vcmpps_avx512vl(local_80,auVar30,2);
      uVar90 = (uint)uVar84 & (uint)uVar84 + 0xff & (uint)uVar147;
      uVar84 = (ulong)uVar90;
      local_6e9 = uVar90 != 0;
    } while (local_6e9);
  }
  return local_6e9;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }